

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void opengv::relative_pose::modules::fivept_kneip_main
               (Matrix<double,_3,_5,_0,_3,_5> *f1,Matrix<double,_3,_5,_0,_3,_5> *f2,
               rotations_t *rotations)

{
  PointerType pdVar1;
  RhsNested *pRVar2;
  complex<double> *__y;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  *pCVar14;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  *pCVar15;
  scalar_constant_op<double> sVar16;
  double *pdVar17;
  undefined1 *puVar18;
  double *pdVar19;
  int i;
  double dVar20;
  long lVar21;
  undefined1 auVar22 [16];
  XprTypeNested pMVar23;
  Scalar SVar24;
  ResScalar RVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  undefined8 extraout_XMM0_Qb_04;
  undefined8 extraout_XMM0_Qb_05;
  undefined8 extraout_XMM0_Qb_06;
  undefined8 extraout_XMM0_Qb_07;
  undefined1 auVar31 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  Vector3d tempVector1;
  Matrix<double,_3,_5,_0,_3,_5> normalVectors;
  Vector3d tempVector2;
  rotation_t finalRotation;
  Vector3d trans01;
  Matrix3d eval;
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  c_2;
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  c_1;
  Vector3d trans02;
  Vector3d trans34;
  Vector3d trans24;
  Vector3d trans23;
  Vector3d trans14;
  Vector3d trans13;
  Vector3d trans12;
  Vector3d trans04;
  Vector3d trans03;
  Matrix3d temp1;
  Matrix3d temp2;
  Matrix<std::complex<double>,_20,_1,_0,_20,_1> D;
  EigenSolver<Eigen::Matrix<double,_20,_20,_0,_20,_20>_> Eig;
  Matrix<std::complex<double>,_20,_20,_0,_20,_20> V;
  Matrix<double,_20,_20,_0,_20,_20> M;
  Matrix<double,_66,_197,_0,_66,_197> groebnerMatrix;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  *pCStack_20598;
  double *pdStack_20590;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  *pCStack_20588;
  double *pdStack_20580;
  long lStack_20578;
  long lStack_20570;
  undefined8 uStack_20568;
  double *pdStack_20560;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  *pCStack_20558;
  undefined1 auStack_20550 [16];
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  *pCStack_20540;
  variable_if_dynamic<long,__1> vStack_20538;
  variable_if_dynamic<long,__1> vStack_20530;
  Index IStack_20528;
  type tStack_20518;
  undefined1 auStack_20500 [8];
  double *pdStack_204f8;
  Matrix<double,_3,_3,_0,_3,_3> *pMStack_204f0;
  undefined1 auStack_204e8 [16];
  XprTypeNested pMStack_204d8;
  undefined1 auStack_204d0 [24];
  undefined1 auStack_204b8 [48];
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  *pCStack_20488;
  scalar_constant_op<double> sStack_20480;
  double *pdStack_20478;
  double *pdStack_20470;
  double *pdStack_20468;
  RhsNested *pRStack_20460;
  double dStack_20458;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  *pCStack_20450;
  double *pdStack_20448;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  *pCStack_20440;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  *pCStack_20438;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  *pCStack_20430;
  undefined8 uStack_20428;
  undefined1 auStack_20418 [8];
  XprTypeNested pMStack_20410;
  XprTypeNested pMStack_20408;
  variable_if_dynamic<long,__1> vStack_20400;
  variable_if_dynamic<long,__1> vStack_203f8;
  XprTypeNested pMStack_203f0;
  XprTypeNested pMStack_203e8;
  scalar_constant_op<double> sStack_203e0;
  XprTypeNested pMStack_203d8;
  Block<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true> BStack_203d0;
  Scalar SStack_203a0;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  CStack_20398;
  _Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  _Stack_20350;
  _Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  _Stack_20330;
  Scalar SStack_20310;
  undefined8 uStack_20308;
  Scalar SStack_20300;
  undefined8 uStack_202f8;
  undefined1 *puStack_202f0;
  undefined8 uStack_202e8;
  double *pdStack_202e0;
  undefined8 uStack_202d8;
  Scalar SStack_202d0;
  undefined8 uStack_202c8;
  rotations_t *prStack_202b8;
  undefined8 uStack_202b0;
  undefined8 uStack_202a8;
  Scalar SStack_202a0;
  undefined8 uStack_20298;
  Scalar SStack_20290;
  undefined8 uStack_20288;
  Scalar SStack_20280;
  undefined8 uStack_20278;
  type tStack_20268;
  type tStack_20250;
  type tStack_20238;
  type tStack_20220;
  type tStack_20208;
  type tStack_201f0;
  type tStack_201d8;
  type tStack_201c0;
  type tStack_201a8;
  value_type vStack_20190;
  value_type vStack_20148;
  undefined1 auStack_20100 [8];
  ulong auStack_200f8 [39];
  EigenSolver<Eigen::Matrix<double,_20,_20,_0,_20,_20>_> EStack_1ffc0;
  undefined1 auStack_1bc80 [24];
  variable_if_dynamic<long,__1> vStack_1bc68;
  variable_if_dynamic<long,__1> vStack_1bc60;
  Index IStack_1bc58;
  complex<double> acStack_1bbe0 [390];
  PlainObjectBase<Eigen::Matrix<double,20,20,0,20,20>> aPStack_1a380 [240];
  undefined8 uStack_1a290;
  undefined8 uStack_1a1e8;
  undefined8 uStack_1a140;
  undefined8 uStack_1a098;
  undefined8 uStack_19ff0;
  undefined8 uStack_19f48;
  undefined8 uStack_19ea0;
  undefined8 uStack_19df8;
  undefined8 uStack_19d50;
  undefined8 uStack_197a8;
  Matrix<double,_66,_197,_0,_66,_197> MStack_196d0;
  undefined1 extraout_var [56];
  
  EStack_1ffc0.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.m_storage.
  m_data.array[1] = 0.0;
  pdStack_20560 = (double *)f2;
  pCStack_20558 =
       (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
        *)f1;
  prStack_202b8 = rotations;
  Eigen::PlainObjectBase<Eigen::Matrix<double,66,197,0,66,197>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,66,197,0,66,197>>>
            ((PlainObjectBase<Eigen::Matrix<double,66,197,0,66,197>> *)&MStack_196d0,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_66,_197,_0,_66,_197>_>_>
              *)&EStack_1ffc0);
  EStack_1ffc0.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.m_storage.
  m_data.array[1] = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&vStack_20190,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)&EStack_1ffc0);
  EStack_1ffc0.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.m_storage.
  m_data.array[1] = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&vStack_20148,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)&EStack_1ffc0);
  _Stack_20330._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _Stack_20330._M_impl.super__Vector_impl_data._M_start = (Matrix<double,_3,_3,_0,_3,_3> *)0x0;
  _Stack_20330._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::push_back((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
               *)&_Stack_20330,&vStack_20190);
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::push_back((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
               *)&_Stack_20330,&vStack_20190);
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::push_back((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
               *)&_Stack_20330,&vStack_20190);
  _Stack_20350._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _Stack_20350._M_impl.super__Vector_impl_data._M_start = (Matrix<double,_3,_3,_0,_3,_3> *)0x0;
  _Stack_20350._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::push_back((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
               *)&_Stack_20350,&vStack_20148);
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::push_back((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
               *)&_Stack_20350,&vStack_20148);
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::push_back((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
               *)&_Stack_20350,&vStack_20148);
  pdStack_202e0 = pdStack_20560 + 8;
  puStack_202f0 = &pCStack_20558->field_0x40;
  SStack_20300 = 9.88131291682493e-324;
  SStack_20310 = 4.94065645841247e-324;
  pCStack_20430 =
       (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
        *)0x0;
  SVar24 = 0.0;
  while (SVar24 != 2.47032822920623e-323) {
    SStack_202d0 = (Scalar)((long)SVar24 + 1);
    pCStack_20440 =
         (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
          *)((((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&pCStack_20558->m_lhs)->
             m_storage).m_data.array + (long)SVar24 * 3);
    pdStack_20448 = pdStack_20560 + (long)SVar24 * 3;
    pCStack_20488 =
         (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
          *)SStack_20310;
    sStack_20480.m_other = (double)pdStack_202e0;
    pdStack_20478 = (double *)SStack_20300;
    puVar18 = puStack_202f0;
    SStack_203a0 = SVar24;
    while( true ) {
      SVar24 = SStack_203a0;
      pCVar14 = pCStack_20488;
      dVar20 = 1.48219693752374e-323;
      if (pCStack_20488 ==
          (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
           *)0x5) break;
      EStack_1ffc0.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
      m_storage.m_data.array[6] =
           (double)((((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                     &pCStack_20558->m_lhs)->m_storage).m_data.array + (long)pCStack_20488 * 3);
      EStack_1ffc0.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
      m_storage.m_data.array[0] = (double)pCStack_20440;
      EStack_1ffc0.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
      m_storage.m_data.array[2] = (double)pCStack_20558;
      EStack_1ffc0.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
      m_storage.m_data.array[3] = 0.0;
      EStack_1ffc0.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
      m_storage.m_data.array[8] = (double)pCStack_20558;
      EStack_1ffc0.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
      m_storage.m_data.array[9] = 0.0;
      EStack_1ffc0.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
      m_storage.m_data.array[10] = (double)pCStack_20488;
      pdStack_20470 = (double *)puVar18;
      EStack_1ffc0.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
      m_storage.m_data.array[4] = SStack_203a0;
      EStack_1ffc0.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
      m_storage.m_data.array[5] = dVar20;
      EStack_1ffc0.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
      m_storage.m_data.array[0xb] = dVar20;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>const>,0>>
                (&vStack_20190,
                 (Product<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>,_0>
                  *)&EStack_1ffc0);
      pCVar15 = pCStack_20488;
      EStack_1ffc0.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
      m_storage.m_data.array[6] = (double)(pdStack_20560 + (long)pCVar14 * 3);
      EStack_1ffc0.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
      m_storage.m_data.array[0] = (double)pdStack_20448;
      EStack_1ffc0.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
      m_storage.m_data.array[2] = (double)pdStack_20560;
      EStack_1ffc0.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
      m_storage.m_data.array[3] = 0.0;
      EStack_1ffc0.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
      m_storage.m_data.array[8] = (double)pdStack_20560;
      EStack_1ffc0.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
      m_storage.m_data.array[9] = 0.0;
      EStack_1ffc0.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
      m_storage.m_data.array[10] = (double)pCStack_20488;
      EStack_1ffc0.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
      m_storage.m_data.array[4] = SVar24;
      EStack_1ffc0.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
      m_storage.m_data.array[5] = dVar20;
      EStack_1ffc0.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
      m_storage.m_data.array[0xb] = dVar20;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>const>,0>>
                (&vStack_20148,
                 (Product<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>,_0>
                  *)&EStack_1ffc0);
      pCStack_20488 =
           (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
            *)((long)pCVar15 + 1);
      lVar21 = 0;
      pCStack_20430 =
           (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
            *)(long)(int)pCStack_20430;
      pdStack_20468 =
           MStack_196d0.super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>.m_storage
           .m_data.array + (long)pCStack_20430;
      pdVar19 = pdStack_20478;
      while (pdVar17 = pdStack_20470, pdVar19 < 5) {
        EStack_1ffc0.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
        m_storage.m_data.array[2] = *(double *)((long)pdStack_20470 + lVar21 + -0x10);
        pCStack_20438 =
             (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
              *)pdVar19;
        EStack_1ffc0.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
        m_storage.m_data.array[0] = (double)&vStack_20190;
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const>>
                  (_Stack_20330._M_impl.super__Vector_impl_data._M_start,
                   (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                    *)&EStack_1ffc0);
        EStack_1ffc0.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
        m_storage.m_data.array[2] = *(double *)((long)pdVar17 + lVar21 + -8);
        EStack_1ffc0.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
        m_storage.m_data.array[0] = (double)&vStack_20190;
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const>>
                  (_Stack_20330._M_impl.super__Vector_impl_data._M_start + 1,
                   (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                    *)&EStack_1ffc0);
        EStack_1ffc0.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
        m_storage.m_data.array[2] = *(double *)((long)pdVar17 + lVar21);
        EStack_1ffc0.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
        m_storage.m_data.array[0] = (double)&vStack_20190;
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const>>
                  (_Stack_20330._M_impl.super__Vector_impl_data._M_start + 2,
                   (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                    *)&EStack_1ffc0);
        sVar16.m_other = sStack_20480.m_other;
        EStack_1ffc0.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
        m_storage.m_data.array[2] = *(double *)((long)sStack_20480.m_other + lVar21 + -0x10);
        EStack_1ffc0.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
        m_storage.m_data.array[0] = (double)&vStack_20148;
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const>>
                  (_Stack_20350._M_impl.super__Vector_impl_data._M_start,
                   (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                    *)&EStack_1ffc0);
        EStack_1ffc0.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
        m_storage.m_data.array[2] = *(double *)((long)sVar16.m_other + lVar21 + -8);
        EStack_1ffc0.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
        m_storage.m_data.array[0] = (double)&vStack_20148;
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const>>
                  (_Stack_20350._M_impl.super__Vector_impl_data._M_start + 1,
                   (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                    *)&EStack_1ffc0);
        EStack_1ffc0.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
        m_storage.m_data.array[2] = *(double *)((long)sVar16.m_other + lVar21);
        EStack_1ffc0.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
        m_storage.m_data.array[0] = (double)&vStack_20148;
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const>>
                  (_Stack_20350._M_impl.super__Vector_impl_data._M_start + 2,
                   (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                    *)&EStack_1ffc0);
        fivept_kneip::initEpncpRowR
                  ((Matrix<double,_1,_197,_1,_1,_197> *)&EStack_1ffc0,
                   (vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                    *)&_Stack_20330,
                   (vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                    *)&_Stack_20350);
        pCVar14 = pCStack_20430;
        pdVar19 = pdStack_20468;
        auStack_1bc80._16_8_ = &MStack_196d0;
        auStack_1bc80._0_8_ = pdStack_20468;
        vStack_1bc68.m_value = (long)pCStack_20430;
        vStack_1bc60.m_value = 0;
        IStack_1bc58 = 1;
        sStack_20480.m_other = sVar16.m_other;
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Matrix<double,66,197,0,66,197>,1,197,false>,Eigen::Matrix<double,1,197,1,1,197>>
                  ((Block<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1,_197,_false> *)auStack_1bc80
                   ,(Matrix<double,_1,_197,_1,_1,_197> *)&EStack_1ffc0);
        pdStack_20468 = pdVar19 + 1;
        pCStack_20430 =
             (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
              *)((long)(((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&pCVar14->m_lhs)
                       ->m_storage).m_data.array + 1);
        lVar21 = lVar21 + 0x18;
        pdVar19 = (double *)((long)pCStack_20438 + 1);
      }
      pdStack_20478 = (double *)((long)pdStack_20478 + 1);
      sStack_20480.m_other = sStack_20480.m_other + 0x18;
      puVar18 = (undefined1 *)((long)pdStack_20470 + 0x18);
    }
    SStack_20300 = (Scalar)((long)SStack_20300 + 1);
    SStack_20310 = (Scalar)((long)SStack_20310 + 1);
    pdStack_202e0 = pdStack_202e0 + 3;
    puStack_202f0 = puStack_202f0 + 0x18;
    SVar24 = SStack_202d0;
  }
  fivept_kneip::initMatrix(&MStack_196d0);
  fivept_kneip::computeBasis(&MStack_196d0);
  EStack_1ffc0.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.m_storage.
  m_data.array[1] = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,20,20,0,20,20>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,20,20,0,20,20>>>
            (aPStack_1a380,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_20,_20,_0,_20,_20>_>_>
              *)&EStack_1ffc0);
  EStack_1ffc0.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.m_storage.
  m_data.array[0] =
       (double)(MStack_196d0.super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>.
                m_storage.m_data.array + 0x2dd5);
  EStack_1ffc0.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.m_storage.
  m_data.array[3] = 2.51973479379036e-322;
  EStack_1ffc0.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.m_storage.
  m_data.array[4] = 8.74496193139006e-322;
  vStack_1bc68.m_value = 0;
  vStack_1bc60.m_value = 0;
  EStack_1ffc0.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.m_storage.
  m_data.array[5] = 3.26083326255223e-322;
  IStack_1bc58 = 0x14;
  EStack_1ffc0.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.m_storage.
  m_data.array[2] = (double)&MStack_196d0;
  auStack_1bc80._0_8_ = aPStack_1a380;
  auStack_1bc80._16_8_ = aPStack_1a380;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,20,20,0,20,20>,10,20,false>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,66,197,0,66,197>,10,20,false>const>>
            ((Block<Eigen::Matrix<double,_20,_20,_0,_20,_20>,_10,_20,_false> *)auStack_1bc80,
             (CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_10,_20,_false>_>
              *)&EStack_1ffc0);
  uStack_1a290 = 0x3ff0000000000000;
  uStack_1a1e8 = 0x3ff0000000000000;
  uStack_1a140 = 0x3ff0000000000000;
  uStack_1a098 = 0x3ff0000000000000;
  uStack_19ff0 = 0x3ff0000000000000;
  uStack_19f48 = 0x3ff0000000000000;
  uStack_19ea0 = 0x3ff0000000000000;
  uStack_19df8 = 0x3ff0000000000000;
  uStack_19d50 = 0x3ff0000000000000;
  uStack_197a8 = 0x3ff0000000000000;
  Eigen::EigenSolver<Eigen::Matrix<double,20,20,0,20,20>>::
  EigenSolver<Eigen::Matrix<double,20,20,0,20,20>>
            ((EigenSolver<Eigen::Matrix<double,20,20,0,20,20>> *)&EStack_1ffc0,
             (EigenBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_> *)aPStack_1a380,true);
  memcpy(auStack_20100,&EStack_1ffc0.m_eivalues,0x140);
  Eigen::EigenSolver<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>::eigenvectors
            ((EigenvectorsType *)auStack_1bc80,&EStack_1ffc0);
  pdStack_204f8 = (double *)0x0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)auStack_20418,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)auStack_20500);
  SVar24 = 0.0;
  sStack_20480.m_other =
       (double)((((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&pCStack_20558->m_lhs)->
                m_storage).m_data.array + 3);
  pCStack_20438 =
       (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
        *)&pCStack_20558->m_rhs;
  pdStack_20470 = pdStack_20560 + 6;
  pdStack_20468 = pdStack_20560 + 3;
  pCStack_20488 = pCStack_20558 + 1;
  pdStack_20478 = pdStack_20560 + 9;
  pCStack_20440 =
       (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
        *)((((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&pCStack_20558[1].m_lhs)->
           m_storage).m_data.array + 3);
  pdStack_20448 = pdStack_20560 + 0xc;
  uStack_202b0 = 0x7fffffffffffffff;
  uStack_202a8 = 0x7fffffffffffffff;
  do {
    if (SVar24 == 9.88131291682493e-323) {
      std::
      _Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
      ::~_Vector_base(&_Stack_20350);
      std::
      _Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
      ::~_Vector_base(&_Stack_20330);
      return;
    }
    auVar26._8_8_ = 0;
    auVar26._0_8_ = auStack_200f8[(long)SVar24 * 2];
    auVar22._8_8_ = 0x7fffffffffffffff;
    auVar22._0_8_ = 0x7fffffffffffffff;
    auVar22 = vandpd_avx512vl(auVar26,auVar22);
    pMVar23 = auVar22._0_8_;
    if ((double)pMVar23 < 0.1) {
      __y = acStack_1bbe0 + (long)SVar24 * 0x14 + 9;
      std::operator/(acStack_1bbe0 + (long)SVar24 * 0x14 + 8,__y);
      auStack_20418 = (undefined1  [8])pMVar23;
      std::operator/(acStack_1bbe0 + (long)SVar24 * 0x14 + 7,__y);
      vStack_20400.m_value = (long)pMVar23;
      std::operator/(acStack_1bbe0 + (long)SVar24 * 0x14 + 6,__y);
      pMStack_203e8 = pMVar23;
      std::operator/(acStack_1bbe0 + (long)SVar24 * 0x14 + 5,__y);
      pMStack_20410 = pMVar23;
      std::operator/(acStack_1bbe0 + (long)SVar24 * 0x14 + 4,__y);
      vStack_203f8.m_value = (long)pMVar23;
      std::operator/(acStack_1bbe0 + (long)SVar24 * 0x14 + 3,__y);
      sStack_203e0.m_other = (double)pMVar23;
      std::operator/(acStack_1bbe0 + (long)SVar24 * 0x14 + 2,__y);
      pMStack_20408 = pMVar23;
      SStack_203a0 = SVar24;
      std::operator/(acStack_1bbe0 + (long)SVar24 * 0x14 + 1,__y);
      pMStack_203f0 = pMVar23;
      std::operator/(acStack_1bbe0 + (long)SVar24 * 0x14,__y);
      pdVar1 = (PointerType)(auStack_20418 + 8);
      auStack_204e8._0_8_ = 1;
      auStack_204e8._8_8_ = 0;
      pMStack_204d8 = (XprTypeNested)0x1;
      auStack_20500 = (undefined1  [8])pdVar1;
      pMStack_204f0 = (Matrix<double,_3,_3,_0,_3,_3> *)auStack_20418;
      pMStack_203d8 = pMVar23;
      auStack_204d0._8_8_ =
           Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::norm
                     ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>
                       *)auStack_20500);
      auStack_204e8._0_8_ = 1;
      auStack_204e8._8_8_ = 0;
      CStack_20398.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.
      m_value = 1;
      CStack_20398.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.
      m_value = 0;
      pMStack_204d8 = (XprTypeNested)0x1;
      CStack_20398.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
           1;
      auStack_20500 = (undefined1  [8])pdVar1;
      pMStack_204f0 = (Matrix<double,_3,_3,_0,_3,_3> *)auStack_20418;
      CStack_20398.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
           pdVar1;
      CStack_20398.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
           (Matrix<double,_3,_3,_0,_3,_3> *)auStack_20418;
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const>>
                (&CStack_20398.m_lhs,
                 (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                  *)auStack_20500);
      pdVar1 = (PointerType)(auStack_20418 + 0x10);
      auStack_204e8._0_8_ = 2;
      auStack_204e8._8_8_ = 0;
      pMStack_204d8 = (XprTypeNested)0x1;
      auStack_20500 = (undefined1  [8])pdVar1;
      pMStack_204f0 = (Matrix<double,_3,_3,_0,_3,_3> *)auStack_20418;
      auStack_204d0._8_8_ =
           Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::norm
                     ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>
                       *)auStack_20500);
      auStack_204e8._0_8_ = (double *)0x2;
      auStack_204e8._8_8_ = 0;
      CStack_20398.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.
      m_value = 2;
      CStack_20398.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.
      m_value = 0;
      pMStack_204d8 = (XprTypeNested)0x1;
      CStack_20398.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
           1;
      auStack_20500 = (undefined1  [8])pdVar1;
      pMStack_204f0 = (Matrix<double,_3,_3,_0,_3,_3> *)auStack_20418;
      CStack_20398.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
           pdVar1;
      CStack_20398.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
           (Matrix<double,_3,_3,_0,_3,_3> *)auStack_20418;
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const>>
                (&CStack_20398.m_lhs,
                 (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                  *)auStack_20500);
      SVar24 = Eigen::internal::determinant_impl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3>::run
                         ((Matrix<double,_3,_3,_0,_3,_3> *)auStack_20418);
      auVar3._8_8_ = 0x7fffffffffffffff;
      auVar3._0_8_ = 0x7fffffffffffffff;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = SVar24 + -1.0;
      auVar22 = vandpd_avx512vl(auVar27,auVar3);
      SVar24 = SStack_203a0;
      if (auVar22._0_8_ < 0.1) {
        auStack_20500 = (undefined1  [8])auStack_20418;
        pCStack_20598 = pCStack_20558;
        pCStack_20588 = pCStack_20558;
        pdStack_20580 = (double *)0x0;
        lStack_20578 = 0;
        pdStack_204f8 = pdStack_20560;
        auStack_204e8._0_8_ = pdStack_20560;
        auStack_204e8._8_8_ = 0;
        pMStack_204d8 = (XprTypeNested)0x0;
        lStack_20570 = 3;
        auStack_204d0._0_8_ = 1.48219693752374e-323;
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
        cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                  ((type *)&BStack_203d0,&pCStack_20598,
                   (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_0>_>
                    *)auStack_20500);
        vStack_20538.m_value = 0;
        vStack_20530.m_value = 0;
        IStack_20528 = 3;
        auStack_20550._0_8_ = &CStack_20398;
        pCStack_20540 = &CStack_20398;
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)auStack_20550,
                   (Matrix<double,_3,_1,_0,_3,_1> *)&BStack_203d0);
        auStack_20500 = (undefined1  [8])auStack_20418;
        pCStack_20598 =
             (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
              *)sStack_20480.m_other;
        pCStack_20588 = pCStack_20558;
        pdStack_20580 = (double *)0x0;
        lStack_20578 = 1;
        lStack_20570 = 3;
        pdStack_204f8 = pdStack_20468;
        auStack_204e8._0_8_ = pdStack_20560;
        auStack_204e8._8_8_ = 0;
        pMStack_204d8 = (XprTypeNested)0x1;
        auStack_204d0._0_8_ = 1.48219693752374e-323;
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
        cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                  ((type *)&BStack_203d0,&pCStack_20598,
                   (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_0>_>
                    *)auStack_20500);
        auStack_20550._0_8_ =
             &CStack_20398.m_lhs.
              super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
              super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
              m_startRow;
        vStack_20538.m_value = 0;
        vStack_20530.m_value = 1;
        IStack_20528 = 3;
        pCStack_20540 = &CStack_20398;
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)auStack_20550,
                   (Matrix<double,_3,_1,_0,_3,_1> *)&BStack_203d0);
        pCStack_20598 = pCStack_20438;
        pCStack_20588 = pCStack_20558;
        pdStack_20580 = (double *)0x0;
        auStack_20500 = (undefined1  [8])auStack_20418;
        lStack_20578 = 2;
        lStack_20570 = 3;
        pdStack_204f8 = pdStack_20470;
        auStack_204e8._0_8_ = pdStack_20560;
        auStack_204e8._8_8_ = 0;
        pMStack_204d8 = (XprTypeNested)0x2;
        auStack_204d0._0_8_ = 1.48219693752374e-323;
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
        cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                  ((type *)&BStack_203d0,&pCStack_20598,
                   (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_0>_>
                    *)auStack_20500);
        auStack_20550._0_8_ = &CStack_20398.m_rhs;
        vStack_20538.m_value = 0;
        vStack_20530.m_value = 2;
        IStack_20528 = 3;
        pCStack_20540 = &CStack_20398;
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)auStack_20550,
                   (Matrix<double,_3,_1,_0,_3,_1> *)&BStack_203d0);
        pCStack_20430 =
             (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
              *)Eigen::internal::determinant_impl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3>::run
                          ((Matrix<double,_3,_3,_0,_3,_3> *)&CStack_20398);
        auStack_20500 = (undefined1  [8])auStack_20418;
        pCStack_20598 = pCStack_20558;
        pCStack_20588 = pCStack_20558;
        pdStack_20580 = (double *)0x0;
        lStack_20578 = 0;
        lStack_20570 = 3;
        pdStack_204f8 = pdStack_20560;
        auStack_204e8._0_8_ = pdStack_20560;
        auStack_204e8._8_8_ = 0;
        pMStack_204d8 = (XprTypeNested)0x0;
        auStack_204d0._0_8_ = 1.48219693752374e-323;
        uStack_20428 = extraout_XMM0_Qb;
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
        cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                  ((type *)&BStack_203d0,&pCStack_20598,
                   (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_0>_>
                    *)auStack_20500);
        vStack_20538.m_value = 0;
        vStack_20530.m_value = 0;
        IStack_20528 = 3;
        auStack_20550._0_8_ = &CStack_20398;
        pCStack_20540 = &CStack_20398;
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)auStack_20550,
                   (Matrix<double,_3,_1,_0,_3,_1> *)&BStack_203d0);
        auStack_20500 = (undefined1  [8])auStack_20418;
        pCStack_20598 =
             (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
              *)sStack_20480.m_other;
        pCStack_20588 = pCStack_20558;
        pdStack_20580 = (double *)0x0;
        lStack_20578 = 1;
        lStack_20570 = 3;
        pdStack_204f8 = pdStack_20468;
        auStack_204e8._0_8_ = pdStack_20560;
        auStack_204e8._8_8_ = 0;
        pMStack_204d8 = (XprTypeNested)0x1;
        auStack_204d0._0_8_ = 1.48219693752374e-323;
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
        cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                  ((type *)&BStack_203d0,&pCStack_20598,
                   (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_0>_>
                    *)auStack_20500);
        auStack_20550._0_8_ =
             &CStack_20398.m_lhs.
              super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
              super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
              m_startRow;
        vStack_20538.m_value = 0;
        vStack_20530.m_value = 1;
        IStack_20528 = 3;
        pCStack_20540 = &CStack_20398;
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)auStack_20550,
                   (Matrix<double,_3,_1,_0,_3,_1> *)&BStack_203d0);
        auStack_20500 = (undefined1  [8])auStack_20418;
        pCStack_20598 = pCStack_20488;
        pCStack_20588 = pCStack_20558;
        pdStack_20580 = (double *)0x0;
        lStack_20578 = 3;
        lStack_20570 = 3;
        pdStack_204f8 = pdStack_20478;
        auStack_204e8._0_8_ = pdStack_20560;
        auStack_204e8._8_8_ = 0;
        pMStack_204d8 = (XprTypeNested)0x3;
        auStack_204d0._0_8_ = 1.48219693752374e-323;
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
        cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                  ((type *)&BStack_203d0,&pCStack_20598,
                   (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_0>_>
                    *)auStack_20500);
        auStack_20550._0_8_ = &CStack_20398.m_rhs;
        vStack_20538.m_value = 0;
        vStack_20530.m_value = 2;
        IStack_20528 = 3;
        pCStack_20540 = &CStack_20398;
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)auStack_20550,
                   (Matrix<double,_3,_1,_0,_3,_1> *)&BStack_203d0);
        pdStack_202e0 =
             (double *)
             Eigen::internal::determinant_impl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3>::run
                       ((Matrix<double,_3,_3,_0,_3,_3> *)&CStack_20398);
        auStack_20500 = (undefined1  [8])auStack_20418;
        pCStack_20598 = pCStack_20558;
        pCStack_20588 = pCStack_20558;
        pdStack_20580 = (double *)0x0;
        lStack_20578 = 0;
        lStack_20570 = 3;
        pdStack_204f8 = pdStack_20560;
        auStack_204e8._0_8_ = pdStack_20560;
        auStack_204e8._8_8_ = 0;
        pMStack_204d8 = (XprTypeNested)0x0;
        auStack_204d0._0_8_ = 1.48219693752374e-323;
        uStack_202d8 = extraout_XMM0_Qb_00;
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
        cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                  ((type *)&BStack_203d0,&pCStack_20598,
                   (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_0>_>
                    *)auStack_20500);
        vStack_20538.m_value = 0;
        vStack_20530.m_value = 0;
        IStack_20528 = 3;
        auStack_20550._0_8_ = &CStack_20398;
        pCStack_20540 = &CStack_20398;
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)auStack_20550,
                   (Matrix<double,_3,_1,_0,_3,_1> *)&BStack_203d0);
        auStack_20500 = (undefined1  [8])auStack_20418;
        pCStack_20598 =
             (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
              *)sStack_20480.m_other;
        pCStack_20588 = pCStack_20558;
        pdStack_20580 = (double *)0x0;
        lStack_20578 = 1;
        lStack_20570 = 3;
        pdStack_204f8 = pdStack_20468;
        auStack_204e8._0_8_ = pdStack_20560;
        auStack_204e8._8_8_ = 0;
        pMStack_204d8 = (XprTypeNested)0x1;
        auStack_204d0._0_8_ = 1.48219693752374e-323;
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
        cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                  ((type *)&BStack_203d0,&pCStack_20598,
                   (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_0>_>
                    *)auStack_20500);
        auStack_20550._0_8_ =
             &CStack_20398.m_lhs.
              super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
              super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
              m_startRow;
        vStack_20538.m_value = 0;
        vStack_20530.m_value = 1;
        IStack_20528 = 3;
        pCStack_20540 = &CStack_20398;
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)auStack_20550,
                   (Matrix<double,_3,_1,_0,_3,_1> *)&BStack_203d0);
        pCStack_20598 = pCStack_20440;
        pCStack_20588 = pCStack_20558;
        pdStack_20580 = (double *)0x0;
        auStack_20500 = (undefined1  [8])auStack_20418;
        lStack_20578 = 4;
        lStack_20570 = 3;
        pdStack_204f8 = pdStack_20448;
        auStack_204e8._0_8_ = pdStack_20560;
        auStack_204e8._8_8_ = 0;
        pMStack_204d8 = (XprTypeNested)0x4;
        auStack_204d0._0_8_ = 1.48219693752374e-323;
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
        cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                  ((type *)&BStack_203d0,&pCStack_20598,
                   (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_0>_>
                    *)auStack_20500);
        auStack_20550._0_8_ = &CStack_20398.m_rhs;
        vStack_20538.m_value = 0;
        vStack_20530.m_value = 2;
        IStack_20528 = 3;
        pCStack_20540 = &CStack_20398;
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)auStack_20550,
                   (Matrix<double,_3,_1,_0,_3,_1> *)&BStack_203d0);
        puStack_202f0 =
             (undefined1 *)
             Eigen::internal::determinant_impl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3>::run
                       ((Matrix<double,_3,_3,_0,_3,_3> *)&CStack_20398);
        auStack_20500 = (undefined1  [8])auStack_20418;
        pCStack_20598 = pCStack_20558;
        pCStack_20588 = pCStack_20558;
        pdStack_20580 = (double *)0x0;
        lStack_20578 = 0;
        lStack_20570 = 3;
        pdStack_204f8 = pdStack_20560;
        auStack_204e8._0_8_ = pdStack_20560;
        auStack_204e8._8_8_ = 0;
        pMStack_204d8 = (XprTypeNested)0x0;
        auStack_204d0._0_8_ = 1.48219693752374e-323;
        uStack_202e8 = extraout_XMM0_Qb_01;
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
        cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                  ((type *)&BStack_203d0,&pCStack_20598,
                   (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_0>_>
                    *)auStack_20500);
        vStack_20538.m_value = 0;
        vStack_20530.m_value = 0;
        IStack_20528 = 3;
        auStack_20550._0_8_ = &CStack_20398;
        pCStack_20540 = &CStack_20398;
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)auStack_20550,
                   (Matrix<double,_3,_1,_0,_3,_1> *)&BStack_203d0);
        pCStack_20598 = pCStack_20438;
        pCStack_20588 = pCStack_20558;
        pdStack_20580 = (double *)0x0;
        auStack_20500 = (undefined1  [8])auStack_20418;
        lStack_20578 = 2;
        lStack_20570 = 3;
        pdStack_204f8 = pdStack_20470;
        auStack_204e8._0_8_ = pdStack_20560;
        auStack_204e8._8_8_ = 0;
        pMStack_204d8 = (XprTypeNested)0x2;
        auStack_204d0._0_8_ = 1.48219693752374e-323;
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
        cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                  ((type *)&BStack_203d0,&pCStack_20598,
                   (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_0>_>
                    *)auStack_20500);
        auStack_20550._0_8_ =
             &CStack_20398.m_lhs.
              super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
              super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
              m_startRow;
        vStack_20538.m_value = 0;
        vStack_20530.m_value = 1;
        IStack_20528 = 3;
        pCStack_20540 = &CStack_20398;
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)auStack_20550,
                   (Matrix<double,_3,_1,_0,_3,_1> *)&BStack_203d0);
        auStack_20500 = (undefined1  [8])auStack_20418;
        pCStack_20598 = pCStack_20488;
        pCStack_20588 = pCStack_20558;
        pdStack_20580 = (double *)0x0;
        lStack_20578 = 3;
        lStack_20570 = 3;
        pdStack_204f8 = pdStack_20478;
        auStack_204e8._0_8_ = pdStack_20560;
        auStack_204e8._8_8_ = 0;
        pMStack_204d8 = (XprTypeNested)0x3;
        auStack_204d0._0_8_ = 1.48219693752374e-323;
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
        cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                  ((type *)&BStack_203d0,&pCStack_20598,
                   (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_0>_>
                    *)auStack_20500);
        auStack_20550._0_8_ = &CStack_20398.m_rhs;
        vStack_20538.m_value = 0;
        vStack_20530.m_value = 2;
        IStack_20528 = 3;
        pCStack_20540 = &CStack_20398;
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)auStack_20550,
                   (Matrix<double,_3,_1,_0,_3,_1> *)&BStack_203d0);
        SStack_20300 = Eigen::internal::determinant_impl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3>::
                       run((Matrix<double,_3,_3,_0,_3,_3> *)&CStack_20398);
        auStack_20500 = (undefined1  [8])auStack_20418;
        pCStack_20598 = pCStack_20558;
        pCStack_20588 = pCStack_20558;
        pdStack_20580 = (double *)0x0;
        lStack_20578 = 0;
        lStack_20570 = 3;
        pdStack_204f8 = pdStack_20560;
        auStack_204e8._0_8_ = pdStack_20560;
        auStack_204e8._8_8_ = 0;
        pMStack_204d8 = (XprTypeNested)0x0;
        auStack_204d0._0_8_ = 1.48219693752374e-323;
        uStack_202f8 = extraout_XMM0_Qb_02;
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
        cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                  ((type *)&BStack_203d0,&pCStack_20598,
                   (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_0>_>
                    *)auStack_20500);
        vStack_20538.m_value = 0;
        vStack_20530.m_value = 0;
        IStack_20528 = 3;
        auStack_20550._0_8_ = &CStack_20398;
        pCStack_20540 = &CStack_20398;
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)auStack_20550,
                   (Matrix<double,_3,_1,_0,_3,_1> *)&BStack_203d0);
        pCStack_20598 = pCStack_20438;
        pCStack_20588 = pCStack_20558;
        pdStack_20580 = (double *)0x0;
        auStack_20500 = (undefined1  [8])auStack_20418;
        lStack_20578 = 2;
        lStack_20570 = 3;
        pdStack_204f8 = pdStack_20470;
        auStack_204e8._0_8_ = pdStack_20560;
        auStack_204e8._8_8_ = 0;
        pMStack_204d8 = (XprTypeNested)0x2;
        auStack_204d0._0_8_ = 1.48219693752374e-323;
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
        cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                  ((type *)&BStack_203d0,&pCStack_20598,
                   (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_0>_>
                    *)auStack_20500);
        auStack_20550._0_8_ =
             &CStack_20398.m_lhs.
              super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
              super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
              m_startRow;
        vStack_20538.m_value = 0;
        vStack_20530.m_value = 1;
        IStack_20528 = 3;
        pCStack_20540 = &CStack_20398;
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)auStack_20550,
                   (Matrix<double,_3,_1,_0,_3,_1> *)&BStack_203d0);
        pCStack_20598 = pCStack_20440;
        pCStack_20588 = pCStack_20558;
        pdStack_20580 = (double *)0x0;
        auStack_20500 = (undefined1  [8])auStack_20418;
        lStack_20578 = 4;
        lStack_20570 = 3;
        pdStack_204f8 = pdStack_20448;
        auStack_204e8._0_8_ = pdStack_20560;
        auStack_204e8._8_8_ = 0;
        pMStack_204d8 = (XprTypeNested)0x4;
        auStack_204d0._0_8_ = 1.48219693752374e-323;
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
        cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                  ((type *)&BStack_203d0,&pCStack_20598,
                   (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_0>_>
                    *)auStack_20500);
        auStack_20550._0_8_ = &CStack_20398.m_rhs;
        vStack_20538.m_value = 0;
        vStack_20530.m_value = 2;
        IStack_20528 = 3;
        pCStack_20540 = &CStack_20398;
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)auStack_20550,
                   (Matrix<double,_3,_1,_0,_3,_1> *)&BStack_203d0);
        SStack_20310 = Eigen::internal::determinant_impl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3>::
                       run((Matrix<double,_3,_3,_0,_3,_3> *)&CStack_20398);
        auStack_20500 = (undefined1  [8])auStack_20418;
        pCStack_20598 = pCStack_20558;
        pCStack_20588 = pCStack_20558;
        pdStack_20580 = (double *)0x0;
        lStack_20578 = 0;
        lStack_20570 = 3;
        pdStack_204f8 = pdStack_20560;
        auStack_204e8._0_8_ = pdStack_20560;
        auStack_204e8._8_8_ = 0;
        pMStack_204d8 = (XprTypeNested)0x0;
        auStack_204d0._0_8_ = 1.48219693752374e-323;
        uStack_20308 = extraout_XMM0_Qb_03;
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
        cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                  ((type *)&BStack_203d0,&pCStack_20598,
                   (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_0>_>
                    *)auStack_20500);
        vStack_20538.m_value = 0;
        vStack_20530.m_value = 0;
        IStack_20528 = 3;
        auStack_20550._0_8_ = &CStack_20398;
        pCStack_20540 = &CStack_20398;
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)auStack_20550,
                   (Matrix<double,_3,_1,_0,_3,_1> *)&BStack_203d0);
        auStack_20500 = (undefined1  [8])auStack_20418;
        pCStack_20598 = pCStack_20488;
        pCStack_20588 = pCStack_20558;
        pdStack_20580 = (double *)0x0;
        lStack_20578 = 3;
        lStack_20570 = 3;
        pdStack_204f8 = pdStack_20478;
        auStack_204e8._0_8_ = pdStack_20560;
        auStack_204e8._8_8_ = 0;
        pMStack_204d8 = (XprTypeNested)0x3;
        auStack_204d0._0_8_ = 1.48219693752374e-323;
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
        cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                  ((type *)&BStack_203d0,&pCStack_20598,
                   (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_0>_>
                    *)auStack_20500);
        auStack_20550._0_8_ =
             &CStack_20398.m_lhs.
              super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
              super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
              m_startRow;
        vStack_20538.m_value = 0;
        vStack_20530.m_value = 1;
        IStack_20528 = 3;
        pCStack_20540 = &CStack_20398;
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)auStack_20550,
                   (Matrix<double,_3,_1,_0,_3,_1> *)&BStack_203d0);
        pCStack_20598 = pCStack_20440;
        pCStack_20588 = pCStack_20558;
        pdStack_20580 = (double *)0x0;
        auStack_20500 = (undefined1  [8])auStack_20418;
        lStack_20578 = 4;
        lStack_20570 = 3;
        pdStack_204f8 = pdStack_20448;
        auStack_204e8._0_8_ = pdStack_20560;
        auStack_204e8._8_8_ = 0;
        pMStack_204d8 = (XprTypeNested)0x4;
        auStack_204d0._0_8_ = 1.48219693752374e-323;
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
        cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                  ((type *)&BStack_203d0,&pCStack_20598,
                   (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_0>_>
                    *)auStack_20500);
        auStack_20550._0_8_ = &CStack_20398.m_rhs;
        vStack_20538.m_value = 0;
        vStack_20530.m_value = 2;
        IStack_20528 = 3;
        pCStack_20540 = &CStack_20398;
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)auStack_20550,
                   (Matrix<double,_3,_1,_0,_3,_1> *)&BStack_203d0);
        SStack_202d0 = Eigen::internal::determinant_impl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3>::
                       run((Matrix<double,_3,_3,_0,_3,_3> *)&CStack_20398);
        auStack_20500 = (undefined1  [8])auStack_20418;
        pCStack_20598 =
             (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
              *)sStack_20480.m_other;
        pCStack_20588 = pCStack_20558;
        pdStack_20580 = (double *)0x0;
        lStack_20578 = 1;
        lStack_20570 = 3;
        pdStack_204f8 = pdStack_20468;
        auStack_204e8._0_8_ = pdStack_20560;
        auStack_204e8._8_8_ = 0;
        pMStack_204d8 = (XprTypeNested)0x1;
        auStack_204d0._0_8_ = 1.48219693752374e-323;
        uStack_202c8 = extraout_XMM0_Qb_04;
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
        cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                  ((type *)&BStack_203d0,&pCStack_20598,
                   (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_0>_>
                    *)auStack_20500);
        vStack_20538.m_value = 0;
        vStack_20530.m_value = 0;
        IStack_20528 = 3;
        auStack_20550._0_8_ = &CStack_20398;
        pCStack_20540 = &CStack_20398;
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)auStack_20550,
                   (Matrix<double,_3,_1,_0,_3,_1> *)&BStack_203d0);
        pCStack_20598 = pCStack_20438;
        pCStack_20588 = pCStack_20558;
        pdStack_20580 = (double *)0x0;
        auStack_20500 = (undefined1  [8])auStack_20418;
        lStack_20578 = 2;
        lStack_20570 = 3;
        pdStack_204f8 = pdStack_20470;
        auStack_204e8._0_8_ = pdStack_20560;
        auStack_204e8._8_8_ = 0;
        pMStack_204d8 = (XprTypeNested)0x2;
        auStack_204d0._0_8_ = 1.48219693752374e-323;
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
        cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                  ((type *)&BStack_203d0,&pCStack_20598,
                   (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_0>_>
                    *)auStack_20500);
        auStack_20550._0_8_ =
             &CStack_20398.m_lhs.
              super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
              super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
              m_startRow;
        vStack_20538.m_value = 0;
        vStack_20530.m_value = 1;
        IStack_20528 = 3;
        pCStack_20540 = &CStack_20398;
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)auStack_20550,
                   (Matrix<double,_3,_1,_0,_3,_1> *)&BStack_203d0);
        auStack_20500 = (undefined1  [8])auStack_20418;
        pCStack_20598 = pCStack_20488;
        pCStack_20588 = pCStack_20558;
        pdStack_20580 = (double *)0x0;
        lStack_20578 = 3;
        lStack_20570 = 3;
        pdStack_204f8 = pdStack_20478;
        auStack_204e8._0_8_ = pdStack_20560;
        auStack_204e8._8_8_ = 0;
        pMStack_204d8 = (XprTypeNested)0x3;
        auStack_204d0._0_8_ = 1.48219693752374e-323;
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
        cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                  ((type *)&BStack_203d0,&pCStack_20598,
                   (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_0>_>
                    *)auStack_20500);
        auStack_20550._0_8_ = &CStack_20398.m_rhs;
        vStack_20538.m_value = 0;
        vStack_20530.m_value = 2;
        IStack_20528 = 3;
        pCStack_20540 = &CStack_20398;
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)auStack_20550,
                   (Matrix<double,_3,_1,_0,_3,_1> *)&BStack_203d0);
        SStack_20280 = Eigen::internal::determinant_impl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3>::
                       run((Matrix<double,_3,_3,_0,_3,_3> *)&CStack_20398);
        auStack_20500 = (undefined1  [8])auStack_20418;
        pCStack_20598 =
             (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
              *)sStack_20480.m_other;
        pCStack_20588 = pCStack_20558;
        pdStack_20580 = (double *)0x0;
        lStack_20578 = 1;
        lStack_20570 = 3;
        pdStack_204f8 = pdStack_20468;
        auStack_204e8._0_8_ = pdStack_20560;
        auStack_204e8._8_8_ = 0;
        pMStack_204d8 = (XprTypeNested)0x1;
        auStack_204d0._0_8_ = 1.48219693752374e-323;
        uStack_20278 = extraout_XMM0_Qb_05;
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
        cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                  ((type *)&BStack_203d0,&pCStack_20598,
                   (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_0>_>
                    *)auStack_20500);
        vStack_20538.m_value = 0;
        vStack_20530.m_value = 0;
        IStack_20528 = 3;
        auStack_20550._0_8_ = &CStack_20398;
        pCStack_20540 = &CStack_20398;
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)auStack_20550,
                   (Matrix<double,_3,_1,_0,_3,_1> *)&BStack_203d0);
        pCStack_20598 = pCStack_20438;
        pCStack_20588 = pCStack_20558;
        pdStack_20580 = (double *)0x0;
        auStack_20500 = (undefined1  [8])auStack_20418;
        lStack_20578 = 2;
        lStack_20570 = 3;
        pdStack_204f8 = pdStack_20470;
        auStack_204e8._0_8_ = pdStack_20560;
        auStack_204e8._8_8_ = 0;
        pMStack_204d8 = (XprTypeNested)0x2;
        auStack_204d0._0_8_ = 1.48219693752374e-323;
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
        cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                  ((type *)&BStack_203d0,&pCStack_20598,
                   (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_0>_>
                    *)auStack_20500);
        auStack_20550._0_8_ =
             &CStack_20398.m_lhs.
              super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
              super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
              m_startRow;
        vStack_20538.m_value = 0;
        vStack_20530.m_value = 1;
        IStack_20528 = 3;
        pCStack_20540 = &CStack_20398;
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)auStack_20550,
                   (Matrix<double,_3,_1,_0,_3,_1> *)&BStack_203d0);
        pCStack_20598 = pCStack_20440;
        pCStack_20588 = pCStack_20558;
        pdStack_20580 = (double *)0x0;
        auStack_20500 = (undefined1  [8])auStack_20418;
        lStack_20578 = 4;
        lStack_20570 = 3;
        pdStack_204f8 = pdStack_20448;
        auStack_204e8._0_8_ = pdStack_20560;
        auStack_204e8._8_8_ = 0;
        pMStack_204d8 = (XprTypeNested)0x4;
        auStack_204d0._0_8_ = 1.48219693752374e-323;
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
        cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                  ((type *)&BStack_203d0,&pCStack_20598,
                   (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_0>_>
                    *)auStack_20500);
        auStack_20550._0_8_ = &CStack_20398.m_rhs;
        vStack_20538.m_value = 0;
        vStack_20530.m_value = 2;
        IStack_20528 = 3;
        pCStack_20540 = &CStack_20398;
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)auStack_20550,
                   (Matrix<double,_3,_1,_0,_3,_1> *)&BStack_203d0);
        SStack_20290 = Eigen::internal::determinant_impl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3>::
                       run((Matrix<double,_3,_3,_0,_3,_3> *)&CStack_20398);
        auStack_20500 = (undefined1  [8])auStack_20418;
        pCStack_20598 =
             (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
              *)sStack_20480.m_other;
        pCStack_20588 = pCStack_20558;
        pdStack_20580 = (double *)0x0;
        lStack_20578 = 1;
        lStack_20570 = 3;
        pdStack_204f8 = pdStack_20468;
        auStack_204e8._0_8_ = pdStack_20560;
        auStack_204e8._8_8_ = 0;
        pMStack_204d8 = (XprTypeNested)0x1;
        auStack_204d0._0_8_ = 1.48219693752374e-323;
        uStack_20288 = extraout_XMM0_Qb_06;
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
        cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                  ((type *)&BStack_203d0,&pCStack_20598,
                   (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_0>_>
                    *)auStack_20500);
        vStack_20538.m_value = 0;
        vStack_20530.m_value = 0;
        IStack_20528 = 3;
        auStack_20550._0_8_ = &CStack_20398;
        pCStack_20540 = &CStack_20398;
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)auStack_20550,
                   (Matrix<double,_3,_1,_0,_3,_1> *)&BStack_203d0);
        auStack_20500 = (undefined1  [8])auStack_20418;
        pCStack_20598 = pCStack_20488;
        pCStack_20588 = pCStack_20558;
        pdStack_20580 = (double *)0x0;
        lStack_20578 = 3;
        lStack_20570 = 3;
        pdStack_204f8 = pdStack_20478;
        auStack_204e8._0_8_ = pdStack_20560;
        auStack_204e8._8_8_ = 0;
        pMStack_204d8 = (XprTypeNested)0x3;
        auStack_204d0._0_8_ = 1.48219693752374e-323;
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
        cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                  ((type *)&BStack_203d0,&pCStack_20598,
                   (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_0>_>
                    *)auStack_20500);
        auStack_20550._0_8_ =
             &CStack_20398.m_lhs.
              super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
              super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
              m_startRow;
        vStack_20538.m_value = 0;
        vStack_20530.m_value = 1;
        IStack_20528 = 3;
        pCStack_20540 = &CStack_20398;
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)auStack_20550,
                   (Matrix<double,_3,_1,_0,_3,_1> *)&BStack_203d0);
        pCStack_20598 = pCStack_20440;
        pCStack_20588 = pCStack_20558;
        pdStack_20580 = (double *)0x0;
        auStack_20500 = (undefined1  [8])auStack_20418;
        lStack_20578 = 4;
        lStack_20570 = 3;
        pdStack_204f8 = pdStack_20448;
        auStack_204e8._0_8_ = pdStack_20560;
        auStack_204e8._8_8_ = 0;
        pMStack_204d8 = (XprTypeNested)0x4;
        auStack_204d0._0_8_ = 1.48219693752374e-323;
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
        cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                  ((type *)&BStack_203d0,&pCStack_20598,
                   (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_0>_>
                    *)auStack_20500);
        auStack_20550._0_8_ = &CStack_20398.m_rhs;
        vStack_20538.m_value = 0;
        vStack_20530.m_value = 2;
        IStack_20528 = 3;
        pCStack_20540 = &CStack_20398;
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)auStack_20550,
                   (Matrix<double,_3,_1,_0,_3,_1> *)&BStack_203d0);
        SStack_202a0 = Eigen::internal::determinant_impl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3>::
                       run((Matrix<double,_3,_3,_0,_3,_3> *)&CStack_20398);
        pCStack_20598 = pCStack_20438;
        pCStack_20588 = pCStack_20558;
        pdStack_20580 = (double *)0x0;
        auStack_20500 = (undefined1  [8])auStack_20418;
        lStack_20578 = 2;
        lStack_20570 = 3;
        pdStack_204f8 = pdStack_20470;
        auStack_204e8._0_8_ = pdStack_20560;
        auStack_204e8._8_8_ = 0;
        pMStack_204d8 = (XprTypeNested)0x2;
        auStack_204d0._0_8_ = 1.48219693752374e-323;
        uStack_20298 = extraout_XMM0_Qb_07;
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
        cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                  ((type *)&BStack_203d0,&pCStack_20598,
                   (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_0>_>
                    *)auStack_20500);
        vStack_20538.m_value = 0;
        vStack_20530.m_value = 0;
        IStack_20528 = 3;
        auStack_20550._0_8_ = &CStack_20398;
        pCStack_20540 = &CStack_20398;
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)auStack_20550,
                   (Matrix<double,_3,_1,_0,_3,_1> *)&BStack_203d0);
        auStack_20500 = (undefined1  [8])auStack_20418;
        pCStack_20598 = pCStack_20488;
        pCStack_20588 = pCStack_20558;
        pdStack_20580 = (double *)0x0;
        lStack_20578 = 3;
        lStack_20570 = 3;
        pdStack_204f8 = pdStack_20478;
        auStack_204e8._0_8_ = pdStack_20560;
        auStack_204e8._8_8_ = 0;
        pMStack_204d8 = (XprTypeNested)0x3;
        auStack_204d0._0_8_ = 1.48219693752374e-323;
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
        cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                  ((type *)&BStack_203d0,&pCStack_20598,
                   (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_0>_>
                    *)auStack_20500);
        auStack_20550._0_8_ =
             &CStack_20398.m_lhs.
              super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
              super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
              m_startRow;
        vStack_20538.m_value = 0;
        vStack_20530.m_value = 1;
        IStack_20528 = 3;
        pCStack_20540 = &CStack_20398;
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)auStack_20550,
                   (Matrix<double,_3,_1,_0,_3,_1> *)&BStack_203d0);
        pCStack_20598 = pCStack_20440;
        pCStack_20588 = pCStack_20558;
        pdStack_20580 = (double *)0x0;
        auStack_20500 = (undefined1  [8])auStack_20418;
        lStack_20578 = 4;
        lStack_20570 = 3;
        pdStack_204f8 = pdStack_20448;
        auStack_204e8._0_8_ = pdStack_20560;
        auStack_204e8._8_8_ = 0;
        pMStack_204d8 = (XprTypeNested)0x4;
        auStack_204d0._0_8_ = 1.48219693752374e-323;
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
        cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                  ((type *)&BStack_203d0,&pCStack_20598,
                   (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_0>_>
                    *)auStack_20500);
        auStack_20550._0_8_ = &CStack_20398.m_rhs;
        vStack_20538.m_value = 0;
        vStack_20530.m_value = 2;
        IStack_20528 = 3;
        pCStack_20540 = &CStack_20398;
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)auStack_20550,
                   (Matrix<double,_3,_1,_0,_3,_1> *)&BStack_203d0);
        auVar31._0_8_ =
             Eigen::internal::determinant_impl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3>::run
                       ((Matrix<double,_3,_3,_0,_3,_3> *)&CStack_20398);
        auVar31._8_56_ = extraout_var;
        auVar33._8_8_ = 0x7fffffffffffffff;
        auVar33._0_8_ = 0x7fffffffffffffff;
        auVar13._8_8_ = uStack_202a8;
        auVar13._0_8_ = uStack_202b0;
        auVar53._8_8_ = 0;
        auVar53._0_8_ = vStack_203f8.m_value;
        auVar37._8_8_ = 0;
        auVar37._0_8_ = pMStack_203e8;
        auVar36._8_8_ = 0;
        auVar36._0_8_ = pMStack_20410;
        auVar43._8_8_ = 0;
        auVar43._0_8_ = pMStack_203f0;
        auVar52._8_8_ = 0;
        auVar52._0_8_ = pMStack_20408;
        auVar42._8_8_ = 0;
        auVar42._0_8_ = sStack_203e0.m_other;
        auVar50._8_8_ = 0;
        auVar50._0_8_ = pMStack_203d8;
        auVar4._8_8_ = uStack_20428;
        auVar4._0_8_ = pCStack_20430;
        auVar22 = vandpd_avx(auVar33,auVar4);
        auVar8._8_8_ = uStack_202d8;
        auVar8._0_8_ = pdStack_202e0;
        auVar26 = vandpd_avx(auVar33,auVar8);
        auVar3 = vandpd_avx(auVar13,auVar31._0_16_);
        auVar7._8_8_ = uStack_202e8;
        auVar7._0_8_ = puStack_202f0;
        auVar27 = vandpd_avx(auVar33,auVar7);
        auVar6._8_8_ = uStack_202f8;
        auVar6._0_8_ = SStack_20300;
        auVar4 = vandpd_avx(auVar33,auVar6);
        auVar5._8_8_ = uStack_20308;
        auVar5._0_8_ = SStack_20310;
        auVar5 = vandpd_avx(auVar33,auVar5);
        auVar9._8_8_ = uStack_202c8;
        auVar9._0_8_ = SStack_202d0;
        auVar6 = vandpd_avx(auVar33,auVar9);
        auVar12._8_8_ = uStack_20278;
        auVar12._0_8_ = SStack_20280;
        auVar7 = vandpd_avx(auVar33,auVar12);
        auVar11._8_8_ = uStack_20288;
        auVar11._0_8_ = SStack_20290;
        auVar8 = vandpd_avx(auVar33,auVar11);
        auVar10._8_8_ = uStack_20298;
        auVar10._0_8_ = SStack_202a0;
        auVar9 = vandpd_avx(auVar33,auVar10);
        auVar28._8_8_ = 0;
        auVar28._0_8_ = vStack_20400.m_value;
        auVar32._8_8_ = 0;
        auVar32._0_8_ = auStack_20418;
        auVar34._8_8_ = 0;
        auVar34._0_8_ = (double)vStack_20400.m_value * (double)vStack_20400.m_value;
        auVar10 = vfmadd231sd_fma(auVar34,auVar32,auVar32);
        auVar41._8_8_ = 0;
        auVar41._0_8_ = (double)vStack_203f8.m_value * (double)vStack_20400.m_value;
        auVar11 = vfmadd231sd_fma(auVar41,auVar32,auVar36);
        auVar44._8_8_ = 0;
        auVar44._0_8_ = (double)pMStack_203f0 * (double)vStack_20400.m_value;
        auVar12 = vfmadd231sd_fma(auVar44,auVar32,auVar52);
        auVar33 = vfmadd231sd_fma(auVar10,auVar37,auVar37);
        auVar10 = vfmadd231sd_fma(auVar11,auVar37,auVar42);
        auVar11 = vfmadd231sd_fma(auVar12,auVar37,auVar50);
        auVar10 = vandpd_avx(auVar13,auVar10);
        auVar11 = vandpd_avx(auVar11,auVar13);
        auVar35._8_8_ = 0;
        auVar35._0_8_ = auVar33._0_8_ + -1.0;
        auVar12 = vandpd_avx(auVar13,auVar35);
        auVar45._8_8_ = 0;
        auVar45._0_8_ = (double)vStack_203f8.m_value * (double)vStack_203f8.m_value;
        auVar33 = vfmadd231sd_fma(auVar45,auVar36,auVar36);
        auVar33 = vfmadd231sd_fma(auVar33,auVar42,auVar42);
        auVar46._8_8_ = 0;
        auVar46._0_8_ = auVar33._0_8_ + -1.0;
        auVar33 = vandpd_avx(auVar46,auVar13);
        auVar47._8_8_ = 0;
        auVar47._0_8_ = (double)vStack_203f8.m_value * (double)pMStack_203f0;
        auVar34 = vfmadd231sd_fma(auVar47,auVar36,auVar52);
        auVar34 = vfmadd231sd_fma(auVar34,auVar42,auVar50);
        auVar34 = vandpd_avx(auVar34,auVar13);
        auVar48._8_8_ = 0;
        auVar48._0_8_ = (double)pMStack_203f0 * (double)pMStack_203f0;
        auVar35 = vfmadd231sd_fma(auVar48,auVar52,auVar52);
        auVar35 = vfmadd231sd_fma(auVar35,auVar50,auVar50);
        auVar51._8_8_ = 0;
        auVar51._0_8_ = (double)vStack_203f8.m_value * (double)pMStack_20408;
        auVar36 = vfmsub231sd_fma(auVar51,auVar36,auVar43);
        auVar49._8_8_ = 0;
        auVar49._0_8_ = auVar35._0_8_ + -1.0;
        auVar35 = vandpd_avx(auVar49,auVar13);
        auVar38._8_8_ = 0;
        auVar38._0_8_ = auVar36._0_8_ - (double)pMStack_203e8;
        auVar36 = vandpd_avx(auVar13,auVar38);
        auVar39._8_8_ = 0;
        auVar39._0_8_ = (double)pMStack_203f0 * (double)auStack_20418;
        auVar28 = vfmsub231sd_fma(auVar39,auVar28,auVar52);
        auVar29._8_8_ = 0;
        auVar29._0_8_ = (double)vStack_20400.m_value * (double)pMStack_20410;
        auVar29 = vfmsub231sd_fma(auVar29,auVar32,auVar53);
        auVar40._8_8_ = 0;
        auVar40._0_8_ = auVar28._0_8_ - sStack_203e0.m_other;
        auVar28 = vandpd_avx(auVar13,auVar40);
        auVar30._8_8_ = 0;
        auVar30._0_8_ = auVar29._0_8_ - (double)pMStack_203d8;
        auVar29 = vandpd_avx(auVar13,auVar30);
        SVar24 = SStack_203a0;
        if (auVar29._0_8_ +
            auVar28._0_8_ +
            auVar36._0_8_ +
            auVar35._0_8_ +
            auVar34._0_8_ +
            auVar33._0_8_ +
            auVar11._0_8_ +
            auVar22._0_8_ + auVar26._0_8_ + auVar27._0_8_ + auVar4._0_8_ + auVar5._0_8_ +
            auVar6._0_8_ + auVar7._0_8_ + auVar8._0_8_ + auVar9._0_8_ + auVar3._0_8_ + auVar12._0_8_
            + auVar10._0_8_ < 0.001) {
          pCStack_20598 =
               (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                *)auStack_20418;
          auStack_20550._0_8_ = pCStack_20558;
          pCStack_20540 = pCStack_20558;
          vStack_20538.m_value = 0;
          vStack_20530.m_value = 0;
          IStack_20528 = 3;
          pdStack_20590 = pdStack_20560;
          pdStack_20580 = pdStack_20560;
          lStack_20578 = 0;
          lStack_20570 = 0;
          uStack_20568 = 3;
          Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
          cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                    (&tStack_20268,auStack_20550,
                     (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_0>_>
                      *)&pCStack_20598);
          BStack_203d0.
          super_BlockImpl<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_true>.m_startRow.
          m_value = 0;
          BStack_203d0.
          super_BlockImpl<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_true>.m_startCol.
          m_value = 0;
          BStack_203d0.
          super_BlockImpl<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_true>.
          m_outerStride = 3;
          BStack_203d0.
          super_BlockImpl<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_0>.m_data =
               (PointerType)auStack_20500;
          BStack_203d0.
          super_BlockImpl<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_true>.m_xpr =
               (XprTypeNested)auStack_20500;
          Eigen::internal::
          call_assignment<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>,3,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
                    (&BStack_203d0,&tStack_20268);
          pCStack_20598 =
               (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                *)auStack_20418;
          auStack_20550._0_8_ = sStack_20480.m_other;
          pCStack_20540 = pCStack_20558;
          vStack_20538.m_value = 0;
          vStack_20530.m_value = 1;
          IStack_20528 = 3;
          pdStack_20590 = pdStack_20468;
          pdStack_20580 = pdStack_20560;
          lStack_20578 = 0;
          lStack_20570 = 1;
          uStack_20568 = 3;
          Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
          cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                    (&tStack_20268,auStack_20550,
                     (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_0>_>
                      *)&pCStack_20598);
          BStack_203d0.
          super_BlockImpl<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_0>.m_data =
               (PointerType)auStack_204e8;
          BStack_203d0.
          super_BlockImpl<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_true>.m_startRow.
          m_value = 0;
          BStack_203d0.
          super_BlockImpl<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_true>.m_startCol.
          m_value = 1;
          BStack_203d0.
          super_BlockImpl<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_true>.
          m_outerStride = 3;
          BStack_203d0.
          super_BlockImpl<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_true>.m_xpr =
               (XprTypeNested)auStack_20500;
          Eigen::internal::
          call_assignment<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>,3,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
                    (&BStack_203d0,&tStack_20268);
          auStack_20550._0_8_ = pCStack_20438;
          pCStack_20540 = pCStack_20558;
          vStack_20538.m_value = 0;
          pCStack_20598 =
               (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                *)auStack_20418;
          vStack_20530.m_value = 2;
          IStack_20528 = 3;
          pdStack_20590 = pdStack_20470;
          pdStack_20580 = pdStack_20560;
          lStack_20578 = 0;
          lStack_20570 = 2;
          uStack_20568 = 3;
          Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
          cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                    (&tStack_20268,auStack_20550,
                     (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_0>_>
                      *)&pCStack_20598);
          BStack_203d0.
          super_BlockImpl<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_0>.m_data =
               (PointerType)auStack_204d0;
          BStack_203d0.
          super_BlockImpl<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_true>.m_startRow.
          m_value = 0;
          BStack_203d0.
          super_BlockImpl<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_true>.m_startCol.
          m_value = 2;
          BStack_203d0.
          super_BlockImpl<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_true>.
          m_outerStride = 3;
          BStack_203d0.
          super_BlockImpl<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_true>.m_xpr =
               (XprTypeNested)auStack_20500;
          Eigen::internal::
          call_assignment<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>,3,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
                    (&BStack_203d0,&tStack_20268);
          pCStack_20598 =
               (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                *)auStack_20418;
          auStack_20550._0_8_ = pCStack_20488;
          pCStack_20540 = pCStack_20558;
          vStack_20538.m_value = 0;
          vStack_20530.m_value = 3;
          IStack_20528 = 3;
          pdStack_20590 = pdStack_20478;
          pdStack_20580 = pdStack_20560;
          lStack_20578 = 0;
          lStack_20570 = 3;
          uStack_20568 = 3;
          Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
          cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                    (&tStack_20268,auStack_20550,
                     (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_0>_>
                      *)&pCStack_20598);
          BStack_203d0.
          super_BlockImpl<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_0>.m_data =
               (PointerType)auStack_204b8;
          BStack_203d0.
          super_BlockImpl<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_true>.m_startRow.
          m_value = 0;
          BStack_203d0.
          super_BlockImpl<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_true>.m_startCol.
          m_value = 3;
          BStack_203d0.
          super_BlockImpl<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_true>.
          m_outerStride = 3;
          BStack_203d0.
          super_BlockImpl<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_true>.m_xpr =
               (XprTypeNested)auStack_20500;
          Eigen::internal::
          call_assignment<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>,3,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
                    (&BStack_203d0,&tStack_20268);
          auStack_20550._0_8_ = pCStack_20440;
          pCStack_20540 = pCStack_20558;
          vStack_20538.m_value = 0;
          pCStack_20598 =
               (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                *)auStack_20418;
          vStack_20530.m_value = 4;
          IStack_20528 = 3;
          pdStack_20590 = pdStack_20448;
          pdStack_20580 = pdStack_20560;
          lStack_20578 = 0;
          lStack_20570 = 4;
          uStack_20568 = 3;
          Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>::
          cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                    (&tStack_20268,auStack_20550,
                     (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_0>_>
                      *)&pCStack_20598);
          BStack_203d0.
          super_BlockImpl<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_0>.m_data =
               (PointerType)(auStack_204b8 + 0x18);
          BStack_203d0.
          super_BlockImpl<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_true>.m_startRow.
          m_value = 0;
          BStack_203d0.
          super_BlockImpl<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_true>.m_startCol.
          m_value = 4;
          BStack_203d0.
          super_BlockImpl<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_true>.
          m_outerStride = 3;
          BStack_203d0.
          super_BlockImpl<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_true>.m_xpr =
               (XprTypeNested)auStack_20500;
          Eigen::internal::
          call_assignment<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>,3,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
                    (&BStack_203d0,&tStack_20268);
          vStack_20538.m_value = 0;
          vStack_20530.m_value = 1;
          IStack_20528 = 3;
          pdStack_20580 = (double *)0x0;
          lStack_20578 = 0;
          lStack_20570 = 3;
          pCStack_20598 =
               (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                *)auStack_20500;
          pCStack_20588 =
               (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                *)auStack_20500;
          auStack_20550._0_8_ =
               (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                *)auStack_204e8;
          pCStack_20540 =
               (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                *)auStack_20500;
          Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>,3,1,true>>::
          cross<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>,3,1,true>>
                    ((type *)&BStack_203d0,&pCStack_20598,
                     (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_> *)
                     auStack_20550);
          pCStack_20598 =
               (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                *)auStack_20500;
          auStack_20550._0_8_ = auStack_204d0;
          vStack_20538.m_value = 0;
          pdStack_20580 = (double *)0x0;
          lStack_20578 = 0;
          vStack_20530.m_value = 2;
          lStack_20570 = 3;
          IStack_20528 = 3;
          pCStack_20588 = pCStack_20598;
          pCStack_20540 = pCStack_20598;
          Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>,3,1,true>>::
          cross<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>,3,1,true>>
                    (&tStack_20268,&pCStack_20598,
                     (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_> *)
                     auStack_20550);
          pCStack_20598 =
               (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                *)auStack_20500;
          auStack_20550._0_8_ = auStack_204b8;
          vStack_20538.m_value = 0;
          pdStack_20580 = (double *)0x0;
          lStack_20578 = 0;
          vStack_20530.m_value = 3;
          lStack_20570 = 3;
          IStack_20528 = 3;
          pCStack_20588 = pCStack_20598;
          pCStack_20540 = pCStack_20598;
          Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>,3,1,true>>::
          cross<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>,3,1,true>>
                    (&tStack_201a8,&pCStack_20598,
                     (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_> *)
                     auStack_20550);
          pCStack_20598 =
               (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                *)auStack_20500;
          auStack_20550._0_8_ = auStack_204b8 + 0x18;
          vStack_20538.m_value = 0;
          pdStack_20580 = (double *)0x0;
          lStack_20578 = 0;
          vStack_20530.m_value = 4;
          lStack_20570 = 3;
          IStack_20528 = 3;
          pCStack_20588 = pCStack_20598;
          pCStack_20540 = pCStack_20598;
          Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>,3,1,true>>::
          cross<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>,3,1,true>>
                    (&tStack_201c0,&pCStack_20598,
                     (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_> *)
                     auStack_20550);
          pCStack_20588 =
               (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                *)auStack_20500;
          pdStack_20580 = (double *)0x0;
          vStack_20538.m_value = 0;
          lStack_20578 = 1;
          vStack_20530.m_value = 2;
          lStack_20570 = 3;
          IStack_20528 = 3;
          pCStack_20598 =
               (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                *)auStack_204e8;
          auStack_20550._0_8_ =
               (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                *)auStack_204d0;
          pCStack_20540 = pCStack_20588;
          Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>,3,1,true>>::
          cross<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>,3,1,true>>
                    (&tStack_201d8,&pCStack_20598,
                     (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_> *)
                     auStack_20550);
          auStack_20550._0_8_ = auStack_204b8;
          pCStack_20588 =
               (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                *)auStack_20500;
          pdStack_20580 = (double *)0x0;
          vStack_20538.m_value = 0;
          lStack_20578 = 1;
          vStack_20530.m_value = 3;
          lStack_20570 = 3;
          IStack_20528 = 3;
          pCStack_20598 =
               (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                *)auStack_204e8;
          pCStack_20540 = pCStack_20588;
          Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>,3,1,true>>::
          cross<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>,3,1,true>>
                    (&tStack_201f0,&pCStack_20598,
                     (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_> *)
                     auStack_20550);
          pCStack_20588 =
               (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                *)auStack_20500;
          pRVar2 = (RhsNested *)(auStack_204b8 + 0x18);
          pdStack_20580 = (double *)0x0;
          vStack_20538.m_value = 0;
          lStack_20578 = 1;
          vStack_20530.m_value = 4;
          lStack_20570 = 3;
          IStack_20528 = 3;
          pCStack_20598 =
               (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                *)auStack_204e8;
          auStack_20550._0_8_ = pRVar2;
          pCStack_20540 = pCStack_20588;
          Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>,3,1,true>>::
          cross<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>,3,1,true>>
                    (&tStack_20208,&pCStack_20598,
                     (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_> *)
                     auStack_20550);
          auStack_20550._0_8_ = auStack_204b8;
          pCStack_20588 =
               (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                *)auStack_20500;
          pdStack_20580 = (double *)0x0;
          vStack_20538.m_value = 0;
          lStack_20578 = 2;
          vStack_20530.m_value = 3;
          lStack_20570 = 3;
          IStack_20528 = 3;
          pCStack_20598 =
               (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                *)auStack_204d0;
          pCStack_20540 = pCStack_20588;
          Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>,3,1,true>>::
          cross<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>,3,1,true>>
                    (&tStack_20220,&pCStack_20598,
                     (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_> *)
                     auStack_20550);
          pCStack_20588 =
               (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                *)auStack_20500;
          pdStack_20580 = (double *)0x0;
          vStack_20538.m_value = 0;
          lStack_20578 = 2;
          vStack_20530.m_value = 4;
          lStack_20570 = 3;
          IStack_20528 = 3;
          pCStack_20598 =
               (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                *)auStack_204d0;
          auStack_20550._0_8_ = pRVar2;
          pCStack_20540 = pCStack_20588;
          Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>,3,1,true>>::
          cross<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>,3,1,true>>
                    (&tStack_20238,&pCStack_20598,
                     (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_> *)
                     auStack_20550);
          pCStack_20598 =
               (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                *)auStack_204b8;
          pCStack_20588 =
               (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                *)auStack_20500;
          pdStack_20580 = (double *)0x0;
          vStack_20538.m_value = 0;
          lStack_20578 = 3;
          vStack_20530.m_value = 4;
          lStack_20570 = 3;
          IStack_20528 = 3;
          auStack_20550._0_8_ = pRVar2;
          pCStack_20540 = pCStack_20588;
          Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>,3,1,true>>::
          cross<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>,3,1,true>>
                    (&tStack_20250,&pCStack_20598,
                     (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_> *)
                     auStack_20550);
          lVar21 = 0;
          pCStack_20430 = pCStack_20558;
          pdVar19 = pdStack_20560;
          do {
            if (lVar21 == 5) {
              std::
              vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ::push_back(prStack_202b8,(value_type *)auStack_20418);
              SVar24 = SStack_203a0;
              break;
            }
            pCStack_20598 = pCStack_20430;
            pCStack_20588 = pCStack_20558;
            pdStack_20580 = (double *)0x0;
            lStack_20570 = 3;
            lStack_20578 = lVar21;
            Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
            cross<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>
                      ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&BStack_203d0,
                       (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>
                        *)&pCStack_20598);
            pCStack_20598 =
                 (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                  *)auStack_20418;
            pdStack_20580 = pdStack_20560;
            lStack_20578 = 0;
            pCStack_20540 =
                 (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                  *)tStack_20518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                    m_storage.m_data.array[2];
            uStack_20568 = 3;
            auStack_20550._0_8_ =
                 tStack_20518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                 .m_data.array[0];
            auStack_20550._8_8_ =
                 tStack_20518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                 .m_data.array[1];
            pdStack_20590 = pdVar19;
            lStack_20570 = lVar21;
            Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
            cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                      (&tStack_20518,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)&BStack_203d0,
                       (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_0>_>
                        *)&pCStack_20598);
            pCStack_20450 =
                 (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                  *)tStack_20518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                    m_storage.m_data.array[2];
            pRStack_20460 =
                 (RhsNested *)
                 tStack_20518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                 .m_data.array[0];
            dStack_20458 = tStack_20518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                           .m_storage.m_data.array[1];
            RVar25 = Eigen::internal::
                     dot_nocheck<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false>
                     ::run((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)auStack_20550,
                           (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&pRStack_20460);
            SVar24 = SStack_203a0;
            if (RVar25 < 0.0) break;
            pCStack_20598 = pCStack_20430;
            pCStack_20588 = pCStack_20558;
            pdStack_20580 = (double *)0x0;
            lStack_20570 = 3;
            lStack_20578 = lVar21;
            Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
            cross<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>
                      ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&tStack_20268,
                       (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>
                        *)&pCStack_20598);
            pCStack_20598 =
                 (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                  *)auStack_20418;
            pdStack_20580 = pdStack_20560;
            lStack_20578 = 0;
            pCStack_20540 =
                 (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                  *)tStack_20518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                    m_storage.m_data.array[2];
            uStack_20568 = 3;
            auStack_20550._0_8_ =
                 tStack_20518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                 .m_data.array[0];
            auStack_20550._8_8_ =
                 tStack_20518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                 .m_data.array[1];
            pdStack_20590 = pdVar19;
            lStack_20570 = lVar21;
            Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
            cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                      (&tStack_20518,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)&tStack_20268,
                       (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_0>_>
                        *)&pCStack_20598);
            pCStack_20450 =
                 (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                  *)tStack_20518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                    m_storage.m_data.array[2];
            pRStack_20460 =
                 (RhsNested *)
                 tStack_20518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                 .m_data.array[0];
            dStack_20458 = tStack_20518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                           .m_storage.m_data.array[1];
            RVar25 = Eigen::internal::
                     dot_nocheck<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false>
                     ::run((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)auStack_20550,
                           (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&pRStack_20460);
            SVar24 = SStack_203a0;
            if (RVar25 < 0.0) break;
            pCStack_20598 = pCStack_20430;
            pCStack_20588 = pCStack_20558;
            pdStack_20580 = (double *)0x0;
            lStack_20570 = 3;
            lStack_20578 = lVar21;
            Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
            cross<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>
                      ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&tStack_201a8,
                       (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>
                        *)&pCStack_20598);
            pCStack_20598 =
                 (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                  *)auStack_20418;
            pdStack_20580 = pdStack_20560;
            lStack_20578 = 0;
            pCStack_20540 =
                 (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                  *)tStack_20518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                    m_storage.m_data.array[2];
            uStack_20568 = 3;
            auStack_20550._0_8_ =
                 tStack_20518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                 .m_data.array[0];
            auStack_20550._8_8_ =
                 tStack_20518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                 .m_data.array[1];
            pdStack_20590 = pdVar19;
            lStack_20570 = lVar21;
            Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
            cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                      (&tStack_20518,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)&tStack_201a8,
                       (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_0>_>
                        *)&pCStack_20598);
            pCStack_20450 =
                 (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                  *)tStack_20518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                    m_storage.m_data.array[2];
            pRStack_20460 =
                 (RhsNested *)
                 tStack_20518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                 .m_data.array[0];
            dStack_20458 = tStack_20518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                           .m_storage.m_data.array[1];
            RVar25 = Eigen::internal::
                     dot_nocheck<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false>
                     ::run((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)auStack_20550,
                           (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&pRStack_20460);
            SVar24 = SStack_203a0;
            if (RVar25 < 0.0) break;
            pCStack_20598 = pCStack_20430;
            pCStack_20588 = pCStack_20558;
            pdStack_20580 = (double *)0x0;
            lStack_20570 = 3;
            lStack_20578 = lVar21;
            Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
            cross<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>
                      ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&tStack_201c0,
                       (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>
                        *)&pCStack_20598);
            pCStack_20598 =
                 (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                  *)auStack_20418;
            pdStack_20580 = pdStack_20560;
            lStack_20578 = 0;
            pCStack_20540 =
                 (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                  *)tStack_20518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                    m_storage.m_data.array[2];
            uStack_20568 = 3;
            auStack_20550._0_8_ =
                 tStack_20518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                 .m_data.array[0];
            auStack_20550._8_8_ =
                 tStack_20518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                 .m_data.array[1];
            pdStack_20590 = pdVar19;
            lStack_20570 = lVar21;
            Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
            cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                      (&tStack_20518,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)&tStack_201c0,
                       (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_0>_>
                        *)&pCStack_20598);
            pCStack_20450 =
                 (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                  *)tStack_20518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                    m_storage.m_data.array[2];
            pRStack_20460 =
                 (RhsNested *)
                 tStack_20518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                 .m_data.array[0];
            dStack_20458 = tStack_20518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                           .m_storage.m_data.array[1];
            RVar25 = Eigen::internal::
                     dot_nocheck<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false>
                     ::run((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)auStack_20550,
                           (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&pRStack_20460);
            SVar24 = SStack_203a0;
            if (RVar25 < 0.0) break;
            pCStack_20598 = pCStack_20430;
            pCStack_20588 = pCStack_20558;
            pdStack_20580 = (double *)0x0;
            lStack_20570 = 3;
            lStack_20578 = lVar21;
            Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
            cross<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>
                      ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&tStack_201d8,
                       (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>
                        *)&pCStack_20598);
            pCStack_20598 =
                 (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                  *)auStack_20418;
            pdStack_20580 = pdStack_20560;
            lStack_20578 = 0;
            pCStack_20540 =
                 (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                  *)tStack_20518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                    m_storage.m_data.array[2];
            uStack_20568 = 3;
            auStack_20550._0_8_ =
                 tStack_20518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                 .m_data.array[0];
            auStack_20550._8_8_ =
                 tStack_20518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                 .m_data.array[1];
            pdStack_20590 = pdVar19;
            lStack_20570 = lVar21;
            Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
            cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                      (&tStack_20518,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)&tStack_201d8,
                       (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_0>_>
                        *)&pCStack_20598);
            pCStack_20450 =
                 (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                  *)tStack_20518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                    m_storage.m_data.array[2];
            pRStack_20460 =
                 (RhsNested *)
                 tStack_20518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                 .m_data.array[0];
            dStack_20458 = tStack_20518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                           .m_storage.m_data.array[1];
            RVar25 = Eigen::internal::
                     dot_nocheck<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false>
                     ::run((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)auStack_20550,
                           (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&pRStack_20460);
            SVar24 = SStack_203a0;
            if (RVar25 < 0.0) break;
            pCStack_20598 = pCStack_20430;
            pCStack_20588 = pCStack_20558;
            pdStack_20580 = (double *)0x0;
            lStack_20570 = 3;
            lStack_20578 = lVar21;
            Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
            cross<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>
                      ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&tStack_201f0,
                       (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>
                        *)&pCStack_20598);
            pCStack_20598 =
                 (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                  *)auStack_20418;
            pdStack_20580 = pdStack_20560;
            lStack_20578 = 0;
            pCStack_20540 =
                 (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                  *)tStack_20518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                    m_storage.m_data.array[2];
            uStack_20568 = 3;
            auStack_20550._0_8_ =
                 tStack_20518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                 .m_data.array[0];
            auStack_20550._8_8_ =
                 tStack_20518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                 .m_data.array[1];
            pdStack_20590 = pdVar19;
            lStack_20570 = lVar21;
            Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
            cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                      (&tStack_20518,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)&tStack_201f0,
                       (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_0>_>
                        *)&pCStack_20598);
            pCStack_20450 =
                 (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                  *)tStack_20518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                    m_storage.m_data.array[2];
            pRStack_20460 =
                 (RhsNested *)
                 tStack_20518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                 .m_data.array[0];
            dStack_20458 = tStack_20518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                           .m_storage.m_data.array[1];
            RVar25 = Eigen::internal::
                     dot_nocheck<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false>
                     ::run((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)auStack_20550,
                           (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&pRStack_20460);
            SVar24 = SStack_203a0;
            if (RVar25 < 0.0) break;
            pCStack_20598 = pCStack_20430;
            pCStack_20588 = pCStack_20558;
            pdStack_20580 = (double *)0x0;
            lStack_20570 = 3;
            lStack_20578 = lVar21;
            Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
            cross<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>
                      ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&tStack_20208,
                       (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>
                        *)&pCStack_20598);
            pCStack_20598 =
                 (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                  *)auStack_20418;
            pdStack_20580 = pdStack_20560;
            lStack_20578 = 0;
            pCStack_20540 =
                 (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                  *)tStack_20518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                    m_storage.m_data.array[2];
            uStack_20568 = 3;
            auStack_20550._0_8_ =
                 tStack_20518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                 .m_data.array[0];
            auStack_20550._8_8_ =
                 tStack_20518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                 .m_data.array[1];
            pdStack_20590 = pdVar19;
            lStack_20570 = lVar21;
            Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
            cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                      (&tStack_20518,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)&tStack_20208,
                       (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_0>_>
                        *)&pCStack_20598);
            pCStack_20450 =
                 (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                  *)tStack_20518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                    m_storage.m_data.array[2];
            pRStack_20460 =
                 (RhsNested *)
                 tStack_20518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                 .m_data.array[0];
            dStack_20458 = tStack_20518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                           .m_storage.m_data.array[1];
            RVar25 = Eigen::internal::
                     dot_nocheck<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false>
                     ::run((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)auStack_20550,
                           (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&pRStack_20460);
            SVar24 = SStack_203a0;
            if (RVar25 < 0.0) break;
            pCStack_20598 = pCStack_20430;
            pCStack_20588 = pCStack_20558;
            pdStack_20580 = (double *)0x0;
            lStack_20570 = 3;
            lStack_20578 = lVar21;
            Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
            cross<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>
                      ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&tStack_20220,
                       (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>
                        *)&pCStack_20598);
            pCStack_20598 =
                 (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                  *)auStack_20418;
            pdStack_20580 = pdStack_20560;
            lStack_20578 = 0;
            pCStack_20540 =
                 (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                  *)tStack_20518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                    m_storage.m_data.array[2];
            uStack_20568 = 3;
            auStack_20550._0_8_ =
                 tStack_20518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                 .m_data.array[0];
            auStack_20550._8_8_ =
                 tStack_20518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                 .m_data.array[1];
            pdStack_20590 = pdVar19;
            lStack_20570 = lVar21;
            Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
            cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                      (&tStack_20518,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)&tStack_20220,
                       (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_0>_>
                        *)&pCStack_20598);
            pCStack_20450 =
                 (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                  *)tStack_20518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                    m_storage.m_data.array[2];
            pRStack_20460 =
                 (RhsNested *)
                 tStack_20518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                 .m_data.array[0];
            dStack_20458 = tStack_20518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                           .m_storage.m_data.array[1];
            RVar25 = Eigen::internal::
                     dot_nocheck<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false>
                     ::run((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)auStack_20550,
                           (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&pRStack_20460);
            SVar24 = SStack_203a0;
            if (RVar25 < 0.0) break;
            pCStack_20598 = pCStack_20430;
            pCStack_20588 = pCStack_20558;
            pdStack_20580 = (double *)0x0;
            lStack_20570 = 3;
            lStack_20578 = lVar21;
            Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
            cross<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>
                      ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&tStack_20238,
                       (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>
                        *)&pCStack_20598);
            pCStack_20598 =
                 (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                  *)auStack_20418;
            pdStack_20580 = pdStack_20560;
            lStack_20578 = 0;
            pCStack_20540 =
                 (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                  *)tStack_20518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                    m_storage.m_data.array[2];
            uStack_20568 = 3;
            auStack_20550._0_8_ =
                 tStack_20518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                 .m_data.array[0];
            auStack_20550._8_8_ =
                 tStack_20518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                 .m_data.array[1];
            pdStack_20590 = pdVar19;
            lStack_20570 = lVar21;
            Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
            cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                      (&tStack_20518,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)&tStack_20238,
                       (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_0>_>
                        *)&pCStack_20598);
            pCStack_20450 =
                 (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                  *)tStack_20518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                    m_storage.m_data.array[2];
            pRStack_20460 =
                 (RhsNested *)
                 tStack_20518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                 .m_data.array[0];
            dStack_20458 = tStack_20518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                           .m_storage.m_data.array[1];
            RVar25 = Eigen::internal::
                     dot_nocheck<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false>
                     ::run((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)auStack_20550,
                           (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&pRStack_20460);
            SVar24 = SStack_203a0;
            if (RVar25 < 0.0) break;
            pCStack_20598 = pCStack_20430;
            pCStack_20588 = pCStack_20558;
            pdStack_20580 = (double *)0x0;
            lStack_20570 = 3;
            lStack_20578 = lVar21;
            Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
            cross<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>>
                      ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&tStack_20250,
                       (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>_>
                        *)&pCStack_20598);
            pCStack_20598 =
                 (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                  *)auStack_20418;
            pdStack_20580 = pdStack_20560;
            lStack_20578 = 0;
            pCStack_20540 =
                 (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                  *)tStack_20518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                    m_storage.m_data.array[2];
            uStack_20568 = 3;
            auStack_20550._0_8_ =
                 tStack_20518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                 .m_data.array[0];
            auStack_20550._8_8_ =
                 tStack_20518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                 .m_data.array[1];
            pdStack_20590 = pdVar19;
            lStack_20570 = lVar21;
            Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
            cross<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>const,3,1,true>,0>>
                      (&tStack_20518,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)&tStack_20250,
                       (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Block<const_Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_0>_>
                        *)&pCStack_20598);
            pCStack_20450 =
                 (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                  *)tStack_20518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                    m_storage.m_data.array[2];
            pRStack_20460 =
                 (RhsNested *)
                 tStack_20518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                 .m_data.array[0];
            dStack_20458 = tStack_20518.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                           .m_storage.m_data.array[1];
            RVar25 = Eigen::internal::
                     dot_nocheck<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false>
                     ::run((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)auStack_20550,
                           (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&pRStack_20460);
            pCStack_20430 =
                 (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                  *)((((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                      &pCStack_20430->m_lhs)->m_storage).m_data.array + 3);
            lVar21 = lVar21 + 1;
            pdVar19 = pdVar19 + 3;
            SVar24 = SStack_203a0;
          } while (0.0 <= RVar25);
        }
      }
    }
    SVar24 = (Scalar)((long)SVar24 + 1);
  } while( true );
}

Assistant:

void
opengv::relative_pose::modules::fivept_kneip_main(
    const Eigen::Matrix<double,3,5> & f1,
    const Eigen::Matrix<double,3,5> & f2,
    rotations_t & rotations )
{
  Eigen::Matrix<double,66,197> groebnerMatrix =
      Eigen::Matrix<double,66,197>::Zero();
  Eigen::Matrix3d temp1 = Eigen::Matrix3d::Zero();
  Eigen::Matrix3d temp2 = Eigen::Matrix3d::Zero();
  std::vector<Eigen::Matrix3d, Eigen::aligned_allocator<Eigen::Matrix3d> > c_1;
  c_1.push_back(temp1);
  c_1.push_back(temp1);
  c_1.push_back(temp1);
  std::vector<Eigen::Matrix3d, Eigen::aligned_allocator<Eigen::Matrix3d> > c_2;
  c_2.push_back(temp2);
  c_2.push_back(temp2);
  c_2.push_back(temp2);

  int currentRow = 0;

  for( int firstFeat = 0; firstFeat < 5; firstFeat++ )
  {
    for( int secondFeat = firstFeat + 1; secondFeat < 5; secondFeat++ )
    {
      temp1 = f1.col(firstFeat)*f1.col(secondFeat).transpose();
      temp2 = f2.col(firstFeat)*f2.col(secondFeat).transpose();

      for( int thirdFeat = secondFeat + 1; thirdFeat < 5; thirdFeat++ )
      {
        c_1[0] = temp1 * f1(0,thirdFeat);
        c_1[1] = temp1 * f1(1,thirdFeat);
        c_1[2] = temp1 * f1(2,thirdFeat);
        c_2[0] = temp2 * f2(0,thirdFeat);
        c_2[1] = temp2 * f2(1,thirdFeat);
        c_2[2] = temp2 * f2(2,thirdFeat);

        groebnerMatrix.row(currentRow++) =
            fivept_kneip::initEpncpRowR( c_1, c_2 );
      }
    }
  }

  fivept_kneip::initMatrix(groebnerMatrix);
  fivept_kneip::computeBasis(groebnerMatrix);

  Eigen::Matrix<double,20,20> M = Eigen::Matrix<double,20,20>::Zero();
  M.block<10,20>(0,0) = -groebnerMatrix.block<10,20>(51,177);
  M(10,1) = 1.0;
  M(11,2) = 1.0;
  M(12,3) = 1.0;
  M(13,4) = 1.0;
  M(14,5) = 1.0;
  M(15,6) = 1.0;
  M(16,7) = 1.0;
  M(17,8) = 1.0;
  M(18,9) = 1.0;
  M(19,18) = 1.0;

  Eigen::EigenSolver< Eigen::Matrix<double,20,20> > Eig(M,true);
  Eigen::Matrix<std::complex<double>,20,1> D = Eig.eigenvalues();
  Eigen::Matrix<std::complex<double>,20,20> V = Eig.eigenvectors();

  //Eigen::Matrix<std::complex<double>,9,1> tempVector;
  rotation_t finalRotation = Eigen::Matrix3d::Zero();
  for( unsigned int i = 0; i < 20; i++ )
  {
    std::complex<double> tempp;
    tempp = D[i];

    //check if we have a real solution
    if( fabs(tempp.imag()) < 0.1 )
    {
      tempp = V(18,i)/V(19,i);
      finalRotation(0,0) = tempp.real();// tempVector[0] = tempp;
      tempp = V(17,i)/V(19,i);
      finalRotation(0,1) = tempp.real();// tempVector[1] = tempp;
      tempp = V(16,i)/V(19,i);
      finalRotation(0,2) = tempp.real();// tempVector[2] = tempp;
      tempp = V(15,i)/V(19,i);
      finalRotation(1,0) = tempp.real();// tempVector[3] = tempp;
      tempp = V(14,i)/V(19,i);
      finalRotation(1,1) = tempp.real();// tempVector[4] = tempp;
      tempp = V(13,i)/V(19,i);
      finalRotation(1,2) = tempp.real();// tempVector[5] = tempp;
      tempp = V(12,i)/V(19,i);
      finalRotation(2,0) = tempp.real();// tempVector[6] = tempp;
      tempp = V(11,i)/V(19,i);
      finalRotation(2,1) = tempp.real();// tempVector[7] = tempp;
      tempp = V(10,i)/V(19,i);
      finalRotation(2,2) = tempp.real();// tempVector[8] = tempp;

      double tempNorm = finalRotation.row(1).norm();
      finalRotation.row(1) = finalRotation.row(1) / tempNorm;
      tempNorm = finalRotation.row(2).norm();
      finalRotation.row(2) = finalRotation.row(2) / tempNorm;

      //check if the normalized rotation matrix has determinant close enough to 1
      if( fabs( finalRotation.determinant() - 1.0 ) < 0.1 )
      {
        Eigen::Matrix3d eval;
        double totalEval = 0.0;
        eval.col(0) = f1.col(0).cross(finalRotation*f2.col(0));
        eval.col(1) = f1.col(1).cross(finalRotation*f2.col(1));
        eval.col(2) = f1.col(2).cross(finalRotation*f2.col(2));
        totalEval += fabs(eval.determinant());
        eval.col(0) = f1.col(0).cross(finalRotation*f2.col(0));
        eval.col(1) = f1.col(1).cross(finalRotation*f2.col(1));
        eval.col(2) = f1.col(3).cross(finalRotation*f2.col(3));
        totalEval += fabs(eval.determinant());
        eval.col(0) = f1.col(0).cross(finalRotation*f2.col(0));
        eval.col(1) = f1.col(1).cross(finalRotation*f2.col(1));
        eval.col(2) = f1.col(4).cross(finalRotation*f2.col(4));
        totalEval += fabs(eval.determinant());
        eval.col(0) = f1.col(0).cross(finalRotation*f2.col(0));
        eval.col(1) = f1.col(2).cross(finalRotation*f2.col(2));
        eval.col(2) = f1.col(3).cross(finalRotation*f2.col(3));
        totalEval += fabs(eval.determinant());
        eval.col(0) = f1.col(0).cross(finalRotation*f2.col(0));
        eval.col(1) = f1.col(2).cross(finalRotation*f2.col(2));
        eval.col(2) = f1.col(4).cross(finalRotation*f2.col(4));
        totalEval += fabs(eval.determinant());
        eval.col(0) = f1.col(0).cross(finalRotation*f2.col(0));
        eval.col(1) = f1.col(3).cross(finalRotation*f2.col(3));
        eval.col(2) = f1.col(4).cross(finalRotation*f2.col(4));
        totalEval += fabs(eval.determinant());
        eval.col(0) = f1.col(1).cross(finalRotation*f2.col(1));
        eval.col(1) = f1.col(2).cross(finalRotation*f2.col(2));
        eval.col(2) = f1.col(3).cross(finalRotation*f2.col(3));
        totalEval += fabs(eval.determinant());
        eval.col(0) = f1.col(1).cross(finalRotation*f2.col(1));
        eval.col(1) = f1.col(2).cross(finalRotation*f2.col(2));
        eval.col(2) = f1.col(4).cross(finalRotation*f2.col(4));
        totalEval += fabs(eval.determinant());
        eval.col(0) = f1.col(1).cross(finalRotation*f2.col(1));
        eval.col(1) = f1.col(3).cross(finalRotation*f2.col(3));
        eval.col(2) = f1.col(4).cross(finalRotation*f2.col(4));
        totalEval += fabs(eval.determinant());
        eval.col(0) = f1.col(2).cross(finalRotation*f2.col(2));
        eval.col(1) = f1.col(3).cross(finalRotation*f2.col(3));
        eval.col(2) = f1.col(4).cross(finalRotation*f2.col(4));
        totalEval += fabs(eval.determinant());
        totalEval += fabs(
            finalRotation(0,0)*finalRotation(0,0)+
            finalRotation(0,1)*finalRotation(0,1)+
            finalRotation(0,2)*finalRotation(0,2)-1);
        totalEval += fabs(
            finalRotation(0,0)*finalRotation(1,0)+
            finalRotation(0,1)*finalRotation(1,1)+
            finalRotation(0,2)*finalRotation(1,2));
        totalEval += fabs(
            finalRotation(0,0)*finalRotation(2,0)+
            finalRotation(0,1)*finalRotation(2,1)+
            finalRotation(0,2)*finalRotation(2,2));
        totalEval += fabs(
            finalRotation(1,0)*finalRotation(1,0)+
            finalRotation(1,1)*finalRotation(1,1)+
            finalRotation(1,2)*finalRotation(1,2)-1);
        totalEval += fabs(
            finalRotation(1,0)*finalRotation(2,0)+
            finalRotation(1,1)*finalRotation(2,1)+
            finalRotation(1,2)*finalRotation(2,2));
        totalEval += fabs(
            finalRotation(2,0)*finalRotation(2,0)+
            finalRotation(2,1)*finalRotation(2,1)+
            finalRotation(2,2)*finalRotation(2,2)-1);
        totalEval += fabs(
            finalRotation(1,0)*finalRotation(2,1)-
            finalRotation(2,0)*finalRotation(1,1)-finalRotation(0,2));
        totalEval += fabs(
            finalRotation(2,0)*finalRotation(0,1)-
            finalRotation(0,0)*finalRotation(2,1)-finalRotation(1,2));
        totalEval += fabs(
            finalRotation(0,0)*finalRotation(1,1)-
            finalRotation(1,0)*finalRotation(0,1)-finalRotation(2,2));

        //check if the initial constraints are fullfilled to a sufficient extend
        if( totalEval < 0.001 )
        {
          Eigen::Matrix<double,3,5> normalVectors;
          normalVectors.col(0) = f1.col(0).cross(finalRotation * f2.col(0));
          normalVectors.col(1) = f1.col(1).cross(finalRotation * f2.col(1));
          normalVectors.col(2) = f1.col(2).cross(finalRotation * f2.col(2));
          normalVectors.col(3) = f1.col(3).cross(finalRotation * f2.col(3));
          normalVectors.col(4) = f1.col(4).cross(finalRotation * f2.col(4));

          Eigen::Vector3d trans01 =
              normalVectors.col(0).cross(normalVectors.col(1));
          Eigen::Vector3d trans02 =
              normalVectors.col(0).cross(normalVectors.col(2));
          Eigen::Vector3d trans03 =
              normalVectors.col(0).cross(normalVectors.col(3));
          Eigen::Vector3d trans04 =
              normalVectors.col(0).cross(normalVectors.col(4));
          Eigen::Vector3d trans12 =
              normalVectors.col(1).cross(normalVectors.col(2));
          Eigen::Vector3d trans13 =
              normalVectors.col(1).cross(normalVectors.col(3));
          Eigen::Vector3d trans14 =
              normalVectors.col(1).cross(normalVectors.col(4));
          Eigen::Vector3d trans23 =
              normalVectors.col(2).cross(normalVectors.col(3));
          Eigen::Vector3d trans24 =
              normalVectors.col(2).cross(normalVectors.col(4));
          Eigen::Vector3d trans34 =
              normalVectors.col(3).cross(normalVectors.col(4));

          Eigen::Vector3d tempVector1;
          Eigen::Vector3d tempVector2;

          bool positive = true;

          for( int i = 0; i < 5; i++ )
          {
            tempVector1 = trans01.cross( f1.col(i) );
            tempVector2 = trans01.cross( finalRotation * f2.col(i) );
            if( tempVector1.dot(tempVector2) < 0 )
            {
              positive = false;
              break;
            }
            tempVector1 = trans02.cross( f1.col(i) );
            tempVector2 = trans02.cross( finalRotation * f2.col(i) );
            if( tempVector1.dot(tempVector2) < 0 )
            {
              positive = false;
              break;
            }
            tempVector1 = trans03.cross( f1.col(i) );
            tempVector2 = trans03.cross( finalRotation * f2.col(i) );
            if( tempVector1.dot(tempVector2) < 0 )
            {
              positive = false;
              break;
            }
            tempVector1 = trans04.cross( f1.col(i) );
            tempVector2 = trans04.cross( finalRotation * f2.col(i) );
            if( tempVector1.dot(tempVector2) < 0 )
            {
              positive = false;
              break;
            }
            tempVector1 = trans12.cross( f1.col(i) );
            tempVector2 = trans12.cross( finalRotation * f2.col(i) );
            if( tempVector1.dot(tempVector2) < 0 )
            {
              positive = false;
              break;
            }
            tempVector1 = trans13.cross( f1.col(i) );
            tempVector2 = trans13.cross( finalRotation * f2.col(i) );
            if( tempVector1.dot(tempVector2) < 0 )
            {
              positive = false;
              break;
            }
            tempVector1 = trans14.cross( f1.col(i) );
            tempVector2 = trans14.cross( finalRotation * f2.col(i) );
            if( tempVector1.dot(tempVector2) < 0 )
            {
              positive = false;
              break;
            }
            tempVector1 = trans23.cross( f1.col(i) );
            tempVector2 = trans23.cross( finalRotation * f2.col(i) );
            if( tempVector1.dot(tempVector2) < 0 )
            {
              positive = false;
              break;
            }
            tempVector1 = trans24.cross( f1.col(i) );
            tempVector2 = trans24.cross( finalRotation * f2.col(i) );
            if( tempVector1.dot(tempVector2) < 0 )
            {
              positive = false;
              break;
            }
            tempVector1 = trans34.cross( f1.col(i) );
            tempVector2 = trans34.cross( finalRotation * f2.col(i) );
            if( tempVector1.dot(tempVector2) < 0 )
            {
              positive = false;
              break;
            }
          }

          //finally, check if the cheiriality constraint is fullfilled to
          //sufficient extend
          if( positive )
            rotations.push_back(finalRotation);
        }
      }
    }
  }
}